

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  byte bVar51;
  ulong uVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  ulong uVar56;
  byte bVar57;
  ulong unaff_R13;
  long lVar58;
  bool bVar59;
  bool bVar60;
  ulong uVar61;
  uint uVar62;
  uint uVar116;
  uint uVar117;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  uint uVar119;
  uint uVar120;
  uint uVar121;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  uint uVar118;
  uint uVar122;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vint4 bi_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  vint4 ai_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  vint4 bi;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  vint4 ai;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar208;
  float fVar212;
  float fVar213;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar211 [32];
  vint4 ai_1;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined4 uVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  float t;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar230 [64];
  undefined1 auVar238 [32];
  float s;
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_904;
  undefined1 local_900 [32];
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  ulong local_838;
  uint local_82c;
  uint local_828;
  undefined4 local_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  uint local_5b4;
  uint local_5b0;
  Primitive *local_598;
  ulong local_590;
  ulong local_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar103 [32];
  undefined1 auVar110 [32];
  undefined1 auVar113 [32];
  
  PVar7 = prim[1];
  uVar52 = (ulong)(byte)PVar7;
  fVar217 = *(float *)(prim + uVar52 * 0x19 + 0x12);
  auVar66 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar52 * 0x19 + 6));
  auVar161._0_4_ = fVar217 * (ray->dir).field_0.m128[0];
  auVar161._4_4_ = fVar217 * (ray->dir).field_0.m128[1];
  auVar161._8_4_ = fVar217 * (ray->dir).field_0.m128[2];
  auVar161._12_4_ = fVar217 * (ray->dir).field_0.m128[3];
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 4 + 6)));
  auVar209._0_4_ = fVar217 * auVar66._0_4_;
  auVar209._4_4_ = fVar217 * auVar66._4_4_;
  auVar209._8_4_ = fVar217 * auVar66._8_4_;
  auVar209._12_4_ = fVar217 * auVar66._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 5 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 6 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar52 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar7 * 0xc + uVar52 + 6)));
  uVar61 = (ulong)(uint)((int)(uVar52 * 9) * 2);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar240 = ZEXT1664(auVar71);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + uVar52 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar244 = ZEXT1664(auVar18);
  uVar56 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar246._4_4_ = auVar161._0_4_;
  auVar246._0_4_ = auVar161._0_4_;
  auVar246._8_4_ = auVar161._0_4_;
  auVar246._12_4_ = auVar161._0_4_;
  auVar73 = vshufps_avx(auVar161,auVar161,0x55);
  auVar63 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar217 = auVar63._0_4_;
  auVar194._0_4_ = fVar217 * auVar68._0_4_;
  fVar208 = auVar63._4_4_;
  auVar194._4_4_ = fVar208 * auVar68._4_4_;
  fVar212 = auVar63._8_4_;
  auVar194._8_4_ = fVar212 * auVar68._8_4_;
  fVar213 = auVar63._12_4_;
  auVar194._12_4_ = fVar213 * auVar68._12_4_;
  auVar141._0_4_ = auVar70._0_4_ * fVar217;
  auVar141._4_4_ = auVar70._4_4_ * fVar208;
  auVar141._8_4_ = auVar70._8_4_ * fVar212;
  auVar141._12_4_ = auVar70._12_4_ * fVar213;
  auVar123._0_4_ = auVar72._0_4_ * fVar217;
  auVar123._4_4_ = auVar72._4_4_ * fVar208;
  auVar123._8_4_ = auVar72._8_4_ * fVar212;
  auVar123._12_4_ = auVar72._12_4_ * fVar213;
  auVar63 = vfmadd231ps_fma(auVar194,auVar73,auVar66);
  auVar65 = vfmadd231ps_fma(auVar141,auVar73,auVar69);
  auVar73 = vfmadd231ps_fma(auVar123,auVar18,auVar73);
  auVar64 = vfmadd231ps_fma(auVar63,auVar246,auVar67);
  auVar65 = vfmadd231ps_fma(auVar65,auVar246,auVar17);
  auVar123 = vfmadd231ps_fma(auVar73,auVar71,auVar246);
  auVar247._4_4_ = auVar209._0_4_;
  auVar247._0_4_ = auVar209._0_4_;
  auVar247._8_4_ = auVar209._0_4_;
  auVar247._12_4_ = auVar209._0_4_;
  auVar73 = vshufps_avx(auVar209,auVar209,0x55);
  auVar63 = vshufps_avx(auVar209,auVar209,0xaa);
  fVar217 = auVar63._0_4_;
  auVar210._0_4_ = fVar217 * auVar68._0_4_;
  fVar208 = auVar63._4_4_;
  auVar210._4_4_ = fVar208 * auVar68._4_4_;
  fVar212 = auVar63._8_4_;
  auVar210._8_4_ = fVar212 * auVar68._8_4_;
  fVar213 = auVar63._12_4_;
  auVar210._12_4_ = fVar213 * auVar68._12_4_;
  auVar181._0_4_ = auVar70._0_4_ * fVar217;
  auVar181._4_4_ = auVar70._4_4_ * fVar208;
  auVar181._8_4_ = auVar70._8_4_ * fVar212;
  auVar181._12_4_ = auVar70._12_4_ * fVar213;
  auVar162._0_4_ = auVar72._0_4_ * fVar217;
  auVar162._4_4_ = auVar72._4_4_ * fVar208;
  auVar162._8_4_ = auVar72._8_4_ * fVar212;
  auVar162._12_4_ = auVar72._12_4_ * fVar213;
  auVar66 = vfmadd231ps_fma(auVar210,auVar73,auVar66);
  auVar68 = vfmadd231ps_fma(auVar181,auVar73,auVar69);
  auVar69 = vfmadd231ps_fma(auVar162,auVar73,auVar18);
  auVar70 = vfmadd231ps_fma(auVar66,auVar247,auVar67);
  auVar18 = vfmadd231ps_fma(auVar68,auVar247,auVar17);
  auVar72 = vfmadd231ps_fma(auVar69,auVar247,auVar71);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar67 = vandps_avx(auVar225,auVar64);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar67,auVar218,1);
  bVar60 = (bool)((byte)uVar61 & 1);
  auVar63._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._0_4_;
  bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._4_4_;
  bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._8_4_;
  bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar64._12_4_;
  auVar67 = vandps_avx(auVar225,auVar65);
  uVar61 = vcmpps_avx512vl(auVar67,auVar218,1);
  bVar60 = (bool)((byte)uVar61 & 1);
  auVar64._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._0_4_;
  bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar64._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._4_4_;
  bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar64._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._8_4_;
  bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar64._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar65._12_4_;
  auVar67 = vandps_avx(auVar225,auVar123);
  uVar61 = vcmpps_avx512vl(auVar67,auVar218,1);
  bVar60 = (bool)((byte)uVar61 & 1);
  auVar65._0_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar123._0_4_;
  bVar60 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar123._4_4_;
  bVar60 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar123._8_4_;
  bVar60 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar60 * 0x219392ef | (uint)!bVar60 * auVar123._12_4_;
  auVar66 = vrcp14ps_avx512vl(auVar63);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = &DAT_3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar67 = vfnmadd213ps_fma(auVar63,auVar66,auVar219);
  auVar17 = vfmadd132ps_fma(auVar67,auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar64);
  auVar67 = vfnmadd213ps_fma(auVar64,auVar66,auVar219);
  auVar69 = vfmadd132ps_fma(auVar67,auVar66,auVar66);
  auVar66 = vrcp14ps_avx512vl(auVar65);
  auVar67 = vfnmadd213ps_fma(auVar65,auVar66,auVar219);
  auVar71 = vfmadd132ps_fma(auVar67,auVar66,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar52 * 7 + 6);
  auVar67 = vpmovsxwd_avx(auVar67);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar68 = vsubps_avx(auVar67,auVar70);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar52 * 9 + 6);
  auVar67 = vpmovsxwd_avx(auVar66);
  auVar205._0_4_ = auVar17._0_4_ * auVar68._0_4_;
  auVar205._4_4_ = auVar17._4_4_ * auVar68._4_4_;
  auVar205._8_4_ = auVar17._8_4_ * auVar68._8_4_;
  auVar205._12_4_ = auVar17._12_4_ * auVar68._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar70);
  auVar195._0_4_ = auVar17._0_4_ * auVar67._0_4_;
  auVar195._4_4_ = auVar17._4_4_ * auVar67._4_4_;
  auVar195._8_4_ = auVar17._8_4_ * auVar67._8_4_;
  auVar195._12_4_ = auVar17._12_4_ * auVar67._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar66 = vpmovsxwd_avx(auVar68);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar52 * -2 + 6);
  auVar67 = vpmovsxwd_avx(auVar17);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar18);
  auVar220._0_4_ = auVar69._0_4_ * auVar67._0_4_;
  auVar220._4_4_ = auVar69._4_4_ * auVar67._4_4_;
  auVar220._8_4_ = auVar69._8_4_ * auVar67._8_4_;
  auVar220._12_4_ = auVar69._12_4_ * auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar66);
  auVar67 = vsubps_avx(auVar67,auVar18);
  auVar142._0_4_ = auVar69._0_4_ * auVar67._0_4_;
  auVar142._4_4_ = auVar69._4_4_ * auVar67._4_4_;
  auVar142._8_4_ = auVar69._8_4_ * auVar67._8_4_;
  auVar142._12_4_ = auVar69._12_4_ * auVar67._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar56 + uVar52 + 6);
  auVar67 = vpmovsxwd_avx(auVar69);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar72);
  auVar182._0_4_ = auVar71._0_4_ * auVar67._0_4_;
  auVar182._4_4_ = auVar71._4_4_ * auVar67._4_4_;
  auVar182._8_4_ = auVar71._8_4_ * auVar67._8_4_;
  auVar182._12_4_ = auVar71._12_4_ * auVar67._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar52 * 0x17 + 6);
  auVar67 = vpmovsxwd_avx(auVar70);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar67 = vsubps_avx(auVar67,auVar72);
  auVar124._0_4_ = auVar71._0_4_ * auVar67._0_4_;
  auVar124._4_4_ = auVar71._4_4_ * auVar67._4_4_;
  auVar124._8_4_ = auVar71._8_4_ * auVar67._8_4_;
  auVar124._12_4_ = auVar71._12_4_ * auVar67._12_4_;
  auVar67 = vpminsd_avx(auVar205,auVar195);
  auVar66 = vpminsd_avx(auVar220,auVar142);
  auVar67 = vmaxps_avx(auVar67,auVar66);
  auVar66 = vpminsd_avx(auVar182,auVar124);
  uVar224 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar71._4_4_ = uVar224;
  auVar71._0_4_ = uVar224;
  auVar71._8_4_ = uVar224;
  auVar71._12_4_ = uVar224;
  auVar66 = vmaxps_avx512vl(auVar66,auVar71);
  auVar67 = vmaxps_avx(auVar67,auVar66);
  auVar18._8_4_ = 0x3f7ffffa;
  auVar18._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar18._12_4_ = 0x3f7ffffa;
  local_350 = vmulps_avx512vl(auVar67,auVar18);
  auVar67 = vpmaxsd_avx(auVar205,auVar195);
  auVar66 = vpmaxsd_avx(auVar220,auVar142);
  auVar67 = vminps_avx(auVar67,auVar66);
  auVar66 = vpmaxsd_avx(auVar182,auVar124);
  fVar217 = ray->tfar;
  auVar72._4_4_ = fVar217;
  auVar72._0_4_ = fVar217;
  auVar72._8_4_ = fVar217;
  auVar72._12_4_ = fVar217;
  auVar66 = vminps_avx512vl(auVar66,auVar72);
  auVar67 = vminps_avx(auVar67,auVar66);
  auVar73._8_4_ = 0x3f800003;
  auVar73._0_8_ = 0x3f8000033f800003;
  auVar73._12_4_ = 0x3f800003;
  auVar67 = vmulps_avx512vl(auVar67,auVar73);
  auVar66 = vpbroadcastd_avx512vl();
  uVar19 = vcmpps_avx512vl(local_350,auVar67,2);
  local_590 = vpcmpgtd_avx512vl(auVar66,_DAT_01ff0cf0);
  local_590 = ((byte)uVar19 & 0xf) & local_590;
  bVar59 = (char)local_590 == '\0';
  bVar60 = !bVar59;
  local_598 = prim;
  if (bVar59) {
    return bVar60;
  }
LAB_01b49dfd:
  lVar58 = 0;
  for (uVar61 = local_590; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  local_8c8 = (ulong)*(uint *)(prim + 2);
  local_8d0 = (ulong)*(uint *)(prim + lVar58 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[local_8c8].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8d0);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar58 = *(long *)&pGVar8[1].time_range.upper;
  auVar67 = *(undefined1 (*) [16])(lVar58 + (long)p_Var9 * uVar61);
  auVar66 = *(undefined1 (*) [16])(lVar58 + (uVar61 + 1) * (long)p_Var9);
  local_590 = local_590 - 1 & local_590;
  if (local_590 != 0) {
    uVar56 = local_590 - 1 & local_590;
    for (uVar52 = local_590; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar206._0_4_ = auVar67._0_4_ + auVar66._0_4_;
  auVar206._4_4_ = auVar67._4_4_ + auVar66._4_4_;
  auVar206._8_4_ = auVar67._8_4_ + auVar66._8_4_;
  auVar206._12_4_ = auVar67._12_4_ + auVar66._12_4_;
  aVar5 = (ray->org).field_0;
  aVar6 = (ray->dir).field_0.field_1;
  auVar22._8_4_ = 0x3f000000;
  auVar22._0_8_ = 0x3f0000003f000000;
  auVar22._12_4_ = 0x3f000000;
  auVar68 = vmulps_avx512vl(auVar206,auVar22);
  auVar68 = vsubps_avx(auVar68,(undefined1  [16])aVar5);
  auVar68 = vdpps_avx(auVar68,(undefined1  [16])aVar6,0x7f);
  auVar17 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  auVar226._4_12_ = ZEXT812(0) << 0x20;
  auVar226._0_4_ = auVar17._0_4_;
  auVar69 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar226);
  auVar227 = ZEXT1664(auVar69);
  auVar17 = vfnmadd213ss_fma(auVar69,auVar17,ZEXT416(0x40000000));
  auVar230 = ZEXT1664(auVar17);
  fVar217 = auVar68._0_4_ * auVar69._0_4_ * auVar17._0_4_;
  local_490 = ZEXT416((uint)fVar217);
  auVar207._4_4_ = fVar217;
  auVar207._0_4_ = fVar217;
  auVar207._8_4_ = fVar217;
  auVar207._12_4_ = fVar217;
  fStack_570 = fVar217;
  _local_580 = auVar207;
  fStack_56c = fVar217;
  fStack_568 = fVar217;
  fStack_564 = fVar217;
  auVar68 = vfmadd231ps_fma((undefined1  [16])aVar5,(undefined1  [16])aVar6,auVar207);
  auVar68 = vblendps_avx(auVar68,ZEXT816(0) << 0x40,8);
  auVar67 = vsubps_avx(auVar67,auVar68);
  auVar17 = vsubps_avx(*(undefined1 (*) [16])(lVar58 + (uVar61 + 2) * (long)p_Var9),auVar68);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  auVar255 = ZEXT3264(local_7a0);
  local_7c0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar259 = ZEXT3264(local_7c0);
  local_300 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  auVar66 = vsubps_avx(auVar66,auVar68);
  auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar58 + (uVar61 + 3) * (long)p_Var9),auVar68);
  local_1a0 = auVar67._0_4_;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  auVar76._8_4_ = 1;
  auVar76._0_8_ = 0x100000001;
  auVar76._12_4_ = 1;
  auVar76._16_4_ = 1;
  auVar76._20_4_ = 1;
  auVar76._24_4_ = 1;
  auVar76._28_4_ = 1;
  local_500 = ZEXT1632(auVar67);
  local_7e0 = vpermps_avx512vl(auVar76,local_500);
  auVar248 = ZEXT3264(local_7e0);
  auVar77._8_4_ = 2;
  auVar77._0_8_ = 0x200000002;
  auVar77._12_4_ = 2;
  auVar77._16_4_ = 2;
  auVar77._20_4_ = 2;
  auVar77._24_4_ = 2;
  auVar77._28_4_ = 2;
  local_600 = vpermps_avx512vl(auVar77,local_500);
  auVar249 = ZEXT3264(local_600);
  auVar75._8_4_ = 3;
  auVar75._0_8_ = 0x300000003;
  auVar75._12_4_ = 3;
  auVar75._16_4_ = 3;
  auVar75._20_4_ = 3;
  auVar75._24_4_ = 3;
  auVar75._28_4_ = 3;
  local_620 = vpermps_avx512vl(auVar75,local_500);
  auVar250 = ZEXT3264(local_620);
  local_800 = vbroadcastss_avx512vl(auVar66);
  auVar251 = ZEXT3264(local_800);
  local_540 = ZEXT1632(auVar66);
  local_640 = vpermps_avx512vl(auVar76,local_540);
  auVar252 = ZEXT3264(local_640);
  local_660 = vpermps_avx512vl(auVar77,local_540);
  auVar253 = ZEXT3264(local_660);
  local_820 = vpermps_avx512vl(auVar75,local_540);
  auVar254 = ZEXT3264(local_820);
  local_680 = vbroadcastss_avx512vl(auVar17);
  auVar256 = ZEXT3264(local_680);
  local_520 = ZEXT1632(auVar17);
  local_6a0 = vpermps_avx512vl(auVar76,local_520);
  auVar257 = ZEXT3264(local_6a0);
  local_6c0 = vpermps_avx512vl(auVar77,local_520);
  auVar258 = ZEXT3264(local_6c0);
  local_6e0 = vpermps_avx512vl(auVar75,local_520);
  auVar261 = ZEXT3264(local_6e0);
  local_1e0 = vbroadcastss_avx512vl(auVar68);
  _local_560 = ZEXT1632(auVar68);
  _local_2e0 = vpermps_avx2(auVar76,_local_560);
  local_200 = vpermps_avx2(auVar77,_local_560);
  local_220 = vpermps_avx512vl(auVar75,_local_560);
  auVar74 = vpermps_avx2(auVar77,ZEXT1632(CONCAT412(aVar6.field_3.w * aVar6.field_3.w,
                                                    CONCAT48(aVar6.z * aVar6.z,
                                                             CONCAT44(aVar6.y * aVar6.y,
                                                                      aVar6.x * aVar6.x)))));
  auVar74 = vfmadd231ps_avx512vl(auVar74,local_7c0,local_7c0);
  local_320 = vfmadd231ps_avx512vl(auVar74,local_7a0,local_7a0);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  auVar74._16_4_ = 0x7fffffff;
  auVar74._20_4_ = 0x7fffffff;
  auVar74._24_4_ = 0x7fffffff;
  auVar74._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_320,auVar74);
  local_838 = 1;
  local_588 = 0;
  bVar53 = 0;
  local_4b0 = ZEXT816(0x3f80000000000000);
  auVar193 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_1c0 = local_320;
  do {
    auVar67 = vmovshdup_avx(local_4b0);
    fVar212 = local_4b0._0_4_;
    fVar208 = auVar67._0_4_ - fVar212;
    fVar217 = fVar208 * 0.04761905;
    local_780._4_4_ = fVar212;
    local_780._0_4_ = fVar212;
    local_780._8_4_ = fVar212;
    local_780._12_4_ = fVar212;
    local_780._16_4_ = fVar212;
    local_780._20_4_ = fVar212;
    local_780._24_4_ = fVar212;
    local_780._28_4_ = fVar212;
    local_8a0._4_4_ = fVar208;
    local_8a0._0_4_ = fVar208;
    local_8a0._8_4_ = fVar208;
    local_8a0._12_4_ = fVar208;
    local_8a0._16_4_ = fVar208;
    local_8a0._20_4_ = fVar208;
    local_8a0._24_4_ = fVar208;
    local_8a0._28_4_ = fVar208;
    auVar67 = vfmadd231ps_fma(local_780,local_8a0,_DAT_02020f20);
    auVar74 = vsubps_avx(auVar193._0_32_,ZEXT1632(auVar67));
    fVar212 = auVar67._0_4_;
    fVar213 = auVar67._4_4_;
    fVar214 = auVar67._8_4_;
    fVar215 = auVar67._12_4_;
    fVar216 = auVar74._0_4_;
    fVar160 = auVar74._4_4_;
    fVar229 = auVar74._8_4_;
    fVar232 = auVar74._12_4_;
    fVar234 = auVar74._16_4_;
    fVar236 = auVar74._20_4_;
    fVar237 = auVar74._24_4_;
    auVar84._4_4_ = fVar160 * fVar160 * -fVar213;
    auVar84._0_4_ = fVar216 * fVar216 * -fVar212;
    auVar84._8_4_ = fVar229 * fVar229 * -fVar214;
    auVar84._12_4_ = fVar232 * fVar232 * -fVar215;
    auVar84._16_4_ = fVar234 * fVar234 * -0.0;
    auVar84._20_4_ = fVar236 * fVar236 * -0.0;
    auVar84._24_4_ = fVar237 * fVar237 * -0.0;
    auVar84._28_4_ = 0x80000000;
    auVar193._28_36_ = auVar227._28_36_;
    auVar193._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * fVar215,
                            CONCAT48(fVar214 * fVar214,CONCAT44(fVar213 * fVar213,fVar212 * fVar212)
                                    )));
    fVar228 = fVar212 * 3.0;
    fVar231 = fVar213 * 3.0;
    fVar233 = fVar214 * 3.0;
    fVar235 = fVar215 * 3.0;
    auVar227._28_36_ = auVar230._28_36_;
    auVar227._0_28_ = ZEXT1628(CONCAT412(fVar235,CONCAT48(fVar233,CONCAT44(fVar231,fVar228))));
    auVar157._0_4_ = fVar212 * fVar212 * (fVar228 + -5.0) + 2.0;
    auVar157._4_4_ = fVar213 * fVar213 * (fVar231 + -5.0) + 2.0;
    auVar157._8_4_ = fVar214 * fVar214 * (fVar233 + -5.0) + 2.0;
    auVar157._12_4_ = fVar215 * fVar215 * (fVar235 + -5.0) + 2.0;
    auVar157._16_4_ = 0x40000000;
    auVar157._20_4_ = 0x40000000;
    auVar157._24_4_ = 0x40000000;
    auVar157._28_4_ = 0x40000000;
    auVar241._0_4_ = fVar216 * fVar216;
    auVar241._4_4_ = fVar160 * fVar160;
    auVar241._8_4_ = fVar229 * fVar229;
    auVar241._12_4_ = fVar232 * fVar232;
    auVar241._16_4_ = fVar234 * fVar234;
    auVar241._20_4_ = fVar236 * fVar236;
    auVar241._28_36_ = auVar240._28_36_;
    auVar241._24_4_ = fVar237 * fVar237;
    auVar176._0_4_ = auVar241._0_4_ * (fVar216 * 3.0 + -5.0) + 2.0;
    auVar176._4_4_ = auVar241._4_4_ * (fVar160 * 3.0 + -5.0) + 2.0;
    auVar176._8_4_ = auVar241._8_4_ * (fVar229 * 3.0 + -5.0) + 2.0;
    auVar176._12_4_ = auVar241._12_4_ * (fVar232 * 3.0 + -5.0) + 2.0;
    auVar176._16_4_ = auVar241._16_4_ * (fVar234 * 3.0 + -5.0) + 2.0;
    auVar176._20_4_ = auVar241._20_4_ * (fVar236 * 3.0 + -5.0) + 2.0;
    auVar176._24_4_ = auVar241._24_4_ * (fVar237 * 3.0 + -5.0) + 2.0;
    auVar176._28_4_ = auVar244._28_4_ + -5.0 + 2.0;
    fVar208 = auVar74._28_4_;
    auVar85._4_4_ = fVar213 * fVar213 * -fVar160;
    auVar85._0_4_ = fVar212 * fVar212 * -fVar216;
    auVar85._8_4_ = fVar214 * fVar214 * -fVar229;
    auVar85._12_4_ = fVar215 * fVar215 * -fVar232;
    auVar85._16_4_ = -fVar234 * 0.0 * 0.0;
    auVar85._20_4_ = -fVar236 * 0.0 * 0.0;
    auVar85._24_4_ = -fVar237 * 0.0 * 0.0;
    auVar85._28_4_ = -fVar208;
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar74 = vmulps_avx512vl(auVar84,auVar75);
    auVar76 = vmulps_avx512vl(auVar157,auVar75);
    auVar77 = vmulps_avx512vl(auVar176,auVar75);
    auVar78 = vmulps_avx512vl(auVar85,auVar75);
    auVar79 = vmulps_avx512vl(local_1e0,auVar78);
    auVar86._4_4_ = auVar78._4_4_ * (float)local_2e0._4_4_;
    auVar86._0_4_ = auVar78._0_4_ * (float)local_2e0._0_4_;
    auVar86._8_4_ = auVar78._8_4_ * fStack_2d8;
    auVar86._12_4_ = auVar78._12_4_ * fStack_2d4;
    auVar86._16_4_ = auVar78._16_4_ * fStack_2d0;
    auVar86._20_4_ = auVar78._20_4_ * fStack_2cc;
    auVar86._24_4_ = auVar78._24_4_ * fStack_2c8;
    auVar86._28_4_ = auVar176._28_4_;
    auVar88._4_4_ = local_200._4_4_ * auVar78._4_4_;
    auVar88._0_4_ = local_200._0_4_ * auVar78._0_4_;
    auVar88._8_4_ = local_200._8_4_ * auVar78._8_4_;
    auVar88._12_4_ = local_200._12_4_ * auVar78._12_4_;
    auVar88._16_4_ = local_200._16_4_ * auVar78._16_4_;
    auVar88._20_4_ = local_200._20_4_ * auVar78._20_4_;
    auVar88._24_4_ = local_200._24_4_ * auVar78._24_4_;
    auVar88._28_4_ = 0x40000000;
    auVar78 = vmulps_avx512vl(local_220,auVar78);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar256._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar86,auVar77,auVar257._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar88,auVar77,auVar258._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar78,auVar261._0_32_,auVar77);
    auVar78 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar251._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar76,auVar252._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar76,auVar253._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar254._0_32_,auVar76);
    auVar260._4_4_ = uStack_19c;
    auVar260._0_4_ = local_1a0;
    auVar260._8_4_ = uStack_198;
    auVar260._12_4_ = uStack_194;
    auVar260._16_4_ = uStack_190;
    auVar260._20_4_ = uStack_18c;
    auVar260._24_4_ = uStack_188;
    auVar260._28_4_ = uStack_184;
    auVar67 = vfmadd231ps_fma(auVar78,auVar74,auVar260);
    local_700 = vfmadd231ps_avx512vl(auVar79,auVar74,auVar248._0_32_);
    local_4e0 = vfmadd231ps_avx512vl(auVar80,auVar74,auVar249._0_32_);
    auVar79 = vfmadd231ps_avx512vl(auVar77,auVar250._0_32_,auVar74);
    auVar89._4_4_ = (fVar160 + fVar160) * fVar213;
    auVar89._0_4_ = (fVar216 + fVar216) * fVar212;
    auVar89._8_4_ = (fVar229 + fVar229) * fVar214;
    auVar89._12_4_ = (fVar232 + fVar232) * fVar215;
    auVar89._16_4_ = (fVar234 + fVar234) * 0.0;
    auVar89._20_4_ = (fVar236 + fVar236) * 0.0;
    auVar89._24_4_ = (fVar237 + fVar237) * 0.0;
    auVar89._28_4_ = auVar76._28_4_;
    auVar74 = vsubps_avx(auVar89,auVar241._0_32_);
    auVar200._0_28_ =
         ZEXT1628(CONCAT412((fVar215 + fVar215) * (fVar235 + -5.0) + fVar235 * fVar215,
                            CONCAT48((fVar214 + fVar214) * (fVar233 + -5.0) + fVar233 * fVar214,
                                     CONCAT44((fVar213 + fVar213) * (fVar231 + -5.0) +
                                              fVar231 * fVar213,
                                              (fVar212 + fVar212) * (fVar228 + -5.0) +
                                              fVar228 * fVar212))));
    auVar200._28_4_ = auVar230._28_4_ + -5.0 + 0.0;
    auVar78._8_4_ = 0x40000000;
    auVar78._0_8_ = 0x4000000040000000;
    auVar78._12_4_ = 0x40000000;
    auVar78._16_4_ = 0x40000000;
    auVar78._20_4_ = 0x40000000;
    auVar78._24_4_ = 0x40000000;
    auVar78._28_4_ = 0x40000000;
    auVar76 = vaddps_avx512vl(auVar227._0_32_,auVar78);
    auVar90._4_4_ = (fVar160 + fVar160) * auVar76._4_4_;
    auVar90._0_4_ = (fVar216 + fVar216) * auVar76._0_4_;
    auVar90._8_4_ = (fVar229 + fVar229) * auVar76._8_4_;
    auVar90._12_4_ = (fVar232 + fVar232) * auVar76._12_4_;
    auVar90._16_4_ = (fVar234 + fVar234) * auVar76._16_4_;
    auVar90._20_4_ = (fVar236 + fVar236) * auVar76._20_4_;
    auVar90._24_4_ = (fVar237 + fVar237) * auVar76._24_4_;
    auVar90._28_4_ = auVar76._28_4_;
    auVar91._4_4_ = fVar160 * 3.0 * fVar160;
    auVar91._0_4_ = fVar216 * 3.0 * fVar216;
    auVar91._8_4_ = fVar229 * 3.0 * fVar229;
    auVar91._12_4_ = fVar232 * 3.0 * fVar232;
    auVar91._16_4_ = fVar234 * 3.0 * fVar234;
    auVar91._20_4_ = fVar236 * 3.0 * fVar236;
    auVar91._24_4_ = fVar237 * 3.0 * fVar237;
    auVar91._28_4_ = fVar208;
    auVar76 = vsubps_avx(auVar90,auVar91);
    auVar77 = vsubps_avx(auVar193._0_32_,auVar89);
    auVar78 = vmulps_avx512vl(auVar74,auVar75);
    auVar80 = vmulps_avx512vl(auVar200,auVar75);
    auVar76 = vmulps_avx512vl(auVar76,auVar75);
    auVar77 = vmulps_avx512vl(auVar77,auVar75);
    auVar75 = vmulps_avx512vl(local_1e0,auVar77);
    auVar92._4_4_ = auVar77._4_4_ * (float)local_2e0._4_4_;
    auVar92._0_4_ = auVar77._0_4_ * (float)local_2e0._0_4_;
    auVar92._8_4_ = auVar77._8_4_ * fStack_2d8;
    auVar92._12_4_ = auVar77._12_4_ * fStack_2d4;
    auVar92._16_4_ = auVar77._16_4_ * fStack_2d0;
    auVar92._20_4_ = auVar77._20_4_ * fStack_2cc;
    auVar92._24_4_ = auVar77._24_4_ * fStack_2c8;
    auVar92._28_4_ = auVar244._28_4_;
    auVar93._4_4_ = auVar77._4_4_ * local_200._4_4_;
    auVar93._0_4_ = auVar77._0_4_ * local_200._0_4_;
    auVar93._8_4_ = auVar77._8_4_ * local_200._8_4_;
    auVar93._12_4_ = auVar77._12_4_ * local_200._12_4_;
    auVar93._16_4_ = auVar77._16_4_ * local_200._16_4_;
    auVar93._20_4_ = auVar77._20_4_ * local_200._20_4_;
    auVar93._24_4_ = auVar77._24_4_ * local_200._24_4_;
    auVar93._28_4_ = fVar208 + fVar208;
    auVar77 = vmulps_avx512vl(local_220,auVar77);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar76,auVar256._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar92,auVar76,auVar257._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar93,auVar76,auVar258._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar77,auVar261._0_32_,auVar76);
    auVar77 = vfmadd231ps_avx512vl(auVar75,auVar80,auVar251._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar81,auVar80,auVar252._0_32_);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar80,auVar253._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar254._0_32_,auVar80);
    auVar66 = vfmadd231ps_fma(auVar77,auVar78,auVar260);
    auVar77 = vfmadd231ps_avx512vl(auVar75,auVar78,auVar248._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar249._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar250._0_32_,auVar78);
    auVar99._4_4_ = auVar66._4_4_ * fVar217;
    auVar99._0_4_ = auVar66._0_4_ * fVar217;
    auVar99._8_4_ = auVar66._8_4_ * fVar217;
    auVar99._12_4_ = auVar66._12_4_ * fVar217;
    auVar99._16_4_ = fVar217 * 0.0;
    auVar99._20_4_ = fVar217 * 0.0;
    auVar99._24_4_ = fVar217 * 0.0;
    auVar99._28_4_ = auVar74._28_4_;
    auVar100._4_4_ = auVar77._4_4_ * fVar217;
    auVar100._0_4_ = auVar77._0_4_ * fVar217;
    auVar100._8_4_ = auVar77._8_4_ * fVar217;
    auVar100._12_4_ = auVar77._12_4_ * fVar217;
    auVar100._16_4_ = auVar77._16_4_ * fVar217;
    auVar100._20_4_ = auVar77._20_4_ * fVar217;
    auVar100._24_4_ = auVar77._24_4_ * fVar217;
    auVar100._28_4_ = auVar77._28_4_;
    auVar244 = ZEXT3264(auVar100);
    auVar101._4_4_ = auVar75._4_4_ * fVar217;
    auVar101._0_4_ = auVar75._0_4_ * fVar217;
    auVar101._8_4_ = auVar75._8_4_ * fVar217;
    auVar101._12_4_ = auVar75._12_4_ * fVar217;
    auVar101._16_4_ = auVar75._16_4_ * fVar217;
    auVar101._20_4_ = auVar75._20_4_ * fVar217;
    auVar101._24_4_ = auVar75._24_4_ * fVar217;
    auVar101._28_4_ = auVar75._28_4_;
    fVar208 = auVar76._0_4_ * fVar217;
    fVar212 = auVar76._4_4_ * fVar217;
    auVar94._4_4_ = fVar212;
    auVar94._0_4_ = fVar208;
    fVar213 = auVar76._8_4_ * fVar217;
    auVar94._8_4_ = fVar213;
    fVar214 = auVar76._12_4_ * fVar217;
    auVar94._12_4_ = fVar214;
    fVar215 = auVar76._16_4_ * fVar217;
    auVar94._16_4_ = fVar215;
    fVar216 = auVar76._20_4_ * fVar217;
    auVar94._20_4_ = fVar216;
    fVar217 = auVar76._24_4_ * fVar217;
    auVar94._24_4_ = fVar217;
    auVar94._28_4_ = local_200._28_4_;
    auVar66 = vxorps_avx512vl(auVar261._0_16_,auVar261._0_16_);
    local_900 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_0205fd20,ZEXT1632(auVar66));
    auVar83 = vpermt2ps_avx512vl(local_700,_DAT_0205fd20,ZEXT1632(auVar66));
    auVar77 = ZEXT1632(auVar66);
    auVar78 = vpermt2ps_avx512vl(local_4e0,_DAT_0205fd20,auVar77);
    auVar201._0_4_ = auVar79._0_4_ + fVar208;
    auVar201._4_4_ = auVar79._4_4_ + fVar212;
    auVar201._8_4_ = auVar79._8_4_ + fVar213;
    auVar201._12_4_ = auVar79._12_4_ + fVar214;
    auVar201._16_4_ = auVar79._16_4_ + fVar215;
    auVar201._20_4_ = auVar79._20_4_ + fVar216;
    auVar201._24_4_ = auVar79._24_4_ + fVar217;
    auVar201._28_4_ = auVar79._28_4_ + local_200._28_4_;
    auVar74 = vmaxps_avx(auVar79,auVar201);
    auVar76 = vminps_avx(auVar79,auVar201);
    auVar79 = vpermt2ps_avx512vl(auVar79,_DAT_0205fd20,auVar77);
    auVar84 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,auVar77);
    auVar85 = vpermt2ps_avx512vl(auVar100,_DAT_0205fd20,auVar77);
    auVar260 = ZEXT1632(auVar66);
    auVar86 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar260);
    auVar77 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar260);
    auVar80 = vsubps_avx512vl(auVar79,auVar77);
    auVar77 = vsubps_avx(local_900,ZEXT1632(auVar67));
    auVar75 = vsubps_avx(auVar83,local_700);
    local_720 = vsubps_avx512vl(auVar78,local_4e0);
    auVar81 = vmulps_avx512vl(auVar75,auVar101);
    auVar81 = vfmsub231ps_avx512vl(auVar81,auVar100,local_720);
    auVar82 = vmulps_avx512vl(local_720,auVar99);
    auVar82 = vfmsub231ps_avx512vl(auVar82,auVar101,auVar77);
    auVar87 = vmulps_avx512vl(auVar77,auVar100);
    auVar87 = vfmsub231ps_avx512vl(auVar87,auVar99,auVar75);
    auVar87 = vmulps_avx512vl(auVar87,auVar87);
    auVar82 = vfmadd231ps_avx512vl(auVar87,auVar82,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar81);
    auVar82 = vmulps_avx512vl(local_720,local_720);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar75);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar77,auVar77);
    auVar87 = vrcp14ps_avx512vl(auVar82);
    auVar131._8_4_ = 0x3f800000;
    auVar131._0_8_ = &DAT_3f8000003f800000;
    auVar131._12_4_ = 0x3f800000;
    auVar131._16_4_ = 0x3f800000;
    auVar131._20_4_ = 0x3f800000;
    auVar131._24_4_ = 0x3f800000;
    auVar131._28_4_ = 0x3f800000;
    auVar227 = ZEXT3264(auVar131);
    auVar88 = vfnmadd213ps_avx512vl(auVar87,auVar82,auVar131);
    auVar87 = vfmadd132ps_avx512vl(auVar88,auVar87,auVar87);
    auVar81 = vmulps_avx512vl(auVar81,auVar87);
    auVar88 = vmulps_avx512vl(auVar75,auVar86);
    auVar88 = vfmsub231ps_avx512vl(auVar88,auVar85,local_720);
    auVar89 = vmulps_avx512vl(local_720,auVar84);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar86,auVar77);
    auVar90 = vmulps_avx512vl(auVar77,auVar85);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar84,auVar75);
    auVar90 = vmulps_avx512vl(auVar90,auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar89);
    auVar88 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar88);
    auVar87 = vmulps_avx512vl(auVar88,auVar87);
    auVar81 = vmaxps_avx512vl(auVar81,auVar87);
    auVar81 = vsqrtps_avx512vl(auVar81);
    auVar87 = vmaxps_avx512vl(auVar80,auVar79);
    auVar74 = vmaxps_avx512vl(auVar74,auVar87);
    auVar87 = vaddps_avx512vl(auVar81,auVar74);
    auVar74 = vminps_avx512vl(auVar80,auVar79);
    auVar74 = vminps_avx(auVar76,auVar74);
    auVar74 = vsubps_avx512vl(auVar74,auVar81);
    auVar79._8_4_ = 0x3f800002;
    auVar79._0_8_ = 0x3f8000023f800002;
    auVar79._12_4_ = 0x3f800002;
    auVar79._16_4_ = 0x3f800002;
    auVar79._20_4_ = 0x3f800002;
    auVar79._24_4_ = 0x3f800002;
    auVar79._28_4_ = 0x3f800002;
    auVar76 = vmulps_avx512vl(auVar87,auVar79);
    auVar80._8_4_ = 0x3f7ffffc;
    auVar80._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar80._12_4_ = 0x3f7ffffc;
    auVar80._16_4_ = 0x3f7ffffc;
    auVar80._20_4_ = 0x3f7ffffc;
    auVar80._24_4_ = 0x3f7ffffc;
    auVar80._28_4_ = 0x3f7ffffc;
    local_8c0 = vmulps_avx512vl(auVar74,auVar80);
    auVar95._4_4_ = auVar76._4_4_ * auVar76._4_4_;
    auVar95._0_4_ = auVar76._0_4_ * auVar76._0_4_;
    auVar95._8_4_ = auVar76._8_4_ * auVar76._8_4_;
    auVar95._12_4_ = auVar76._12_4_ * auVar76._12_4_;
    auVar95._16_4_ = auVar76._16_4_ * auVar76._16_4_;
    auVar95._20_4_ = auVar76._20_4_ * auVar76._20_4_;
    auVar95._24_4_ = auVar76._24_4_ * auVar76._24_4_;
    auVar95._28_4_ = local_8c0._28_4_;
    auVar74 = vrsqrt14ps_avx512vl(auVar82);
    auVar81._8_4_ = 0xbf000000;
    auVar81._0_8_ = 0xbf000000bf000000;
    auVar81._12_4_ = 0xbf000000;
    auVar81._16_4_ = 0xbf000000;
    auVar81._20_4_ = 0xbf000000;
    auVar81._24_4_ = 0xbf000000;
    auVar81._28_4_ = 0xbf000000;
    auVar76 = vmulps_avx512vl(auVar82,auVar81);
    auVar96._4_4_ = auVar74._4_4_ * auVar76._4_4_;
    auVar96._0_4_ = auVar74._0_4_ * auVar76._0_4_;
    auVar96._8_4_ = auVar74._8_4_ * auVar76._8_4_;
    auVar96._12_4_ = auVar74._12_4_ * auVar76._12_4_;
    auVar96._16_4_ = auVar74._16_4_ * auVar76._16_4_;
    auVar96._20_4_ = auVar74._20_4_ * auVar76._20_4_;
    auVar96._24_4_ = auVar74._24_4_ * auVar76._24_4_;
    auVar96._28_4_ = auVar76._28_4_;
    auVar76 = vmulps_avx512vl(auVar74,auVar74);
    auVar76 = vmulps_avx512vl(auVar76,auVar96);
    auVar82._8_4_ = 0x3fc00000;
    auVar82._0_8_ = 0x3fc000003fc00000;
    auVar82._12_4_ = 0x3fc00000;
    auVar82._16_4_ = 0x3fc00000;
    auVar82._20_4_ = 0x3fc00000;
    auVar82._24_4_ = 0x3fc00000;
    auVar82._28_4_ = 0x3fc00000;
    auVar79 = vfmadd231ps_avx512vl(auVar76,auVar74,auVar82);
    auVar102._4_4_ = auVar79._4_4_ * auVar77._4_4_;
    auVar102._0_4_ = auVar79._0_4_ * auVar77._0_4_;
    auVar102._8_4_ = auVar79._8_4_ * auVar77._8_4_;
    auVar102._12_4_ = auVar79._12_4_ * auVar77._12_4_;
    auVar102._16_4_ = auVar79._16_4_ * auVar77._16_4_;
    auVar102._20_4_ = auVar79._20_4_ * auVar77._20_4_;
    auVar102._24_4_ = auVar79._24_4_ * auVar77._24_4_;
    auVar102._28_4_ = auVar74._28_4_;
    auVar74 = vmulps_avx512vl(auVar75,auVar79);
    auVar76 = vmulps_avx512vl(local_720,auVar79);
    local_400 = ZEXT1632(auVar67);
    auVar80 = vsubps_avx512vl(auVar260,local_400);
    auVar81 = vsubps_avx512vl(auVar260,local_700);
    auVar82 = vsubps_avx512vl(auVar260,local_4e0);
    auVar49._4_4_ = uStack_2fc;
    auVar49._0_4_ = local_300;
    auVar49._8_4_ = uStack_2f8;
    auVar49._12_4_ = uStack_2f4;
    auVar49._16_4_ = uStack_2f0;
    auVar49._20_4_ = uStack_2ec;
    auVar49._24_4_ = uStack_2e8;
    auVar49._28_4_ = uStack_2e4;
    auVar87 = vmulps_avx512vl(auVar49,auVar82);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar259._0_32_,auVar81);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar255._0_32_,auVar80);
    auVar88 = vmulps_avx512vl(auVar82,auVar82);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar81);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar80,auVar80);
    auVar89 = vmulps_avx512vl(auVar49,auVar76);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar74,auVar259._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar102,auVar255._0_32_);
    auVar76 = vmulps_avx512vl(auVar82,auVar76);
    auVar74 = vfmadd231ps_avx512vl(auVar76,auVar81,auVar74);
    auVar90 = vfmadd231ps_avx512vl(auVar74,auVar80,auVar102);
    auVar91 = vmulps_avx512vl(auVar89,auVar89);
    auVar74 = vsubps_avx(local_1c0,auVar91);
    auVar76 = vmulps_avx512vl(auVar89,auVar90);
    auVar76 = vsubps_avx512vl(auVar87,auVar76);
    auVar92 = vaddps_avx512vl(auVar76,auVar76);
    auVar76 = vmulps_avx512vl(auVar90,auVar90);
    auVar88 = vsubps_avx512vl(auVar88,auVar76);
    auVar76 = vsubps_avx(auVar88,auVar95);
    auVar93 = vmulps_avx512vl(auVar92,auVar92);
    auVar87._8_4_ = 0x40800000;
    auVar87._0_8_ = 0x4080000040800000;
    auVar87._12_4_ = 0x40800000;
    auVar87._16_4_ = 0x40800000;
    auVar87._20_4_ = 0x40800000;
    auVar87._24_4_ = 0x40800000;
    auVar87._28_4_ = 0x40800000;
    auVar87 = vmulps_avx512vl(auVar74,auVar87);
    auVar94 = vmulps_avx512vl(auVar87,auVar76);
    auVar94 = vsubps_avx512vl(auVar93,auVar94);
    uVar61 = vcmpps_avx512vl(auVar94,auVar260,5);
    bVar55 = (byte)uVar61;
    if (bVar55 == 0) {
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar94 = vsqrtps_avx512vl(auVar94);
      auVar95 = vaddps_avx512vl(auVar74,auVar74);
      auVar96 = vrcp14ps_avx512vl(auVar95);
      auVar95 = vfnmadd213ps_avx512vl(auVar95,auVar96,auVar131);
      auVar95 = vfmadd132ps_avx512vl(auVar95,auVar96,auVar96);
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar28._16_4_ = 0x80000000;
      auVar28._20_4_ = 0x80000000;
      auVar28._24_4_ = 0x80000000;
      auVar28._28_4_ = 0x80000000;
      auVar96 = vxorps_avx512vl(auVar92,auVar28);
      auVar96 = vsubps_avx512vl(auVar96,auVar94);
      auVar96 = vmulps_avx512vl(auVar96,auVar95);
      auVar94 = vsubps_avx512vl(auVar94,auVar92);
      auVar94 = vmulps_avx512vl(auVar94,auVar95);
      auVar95 = vfmadd213ps_avx512vl(auVar89,auVar96,auVar90);
      local_380 = vmulps_avx512vl(auVar79,auVar95);
      auVar95 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar90);
      local_3a0 = vmulps_avx512vl(auVar79,auVar95);
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar95 = vblendmps_avx512vl(auVar95,auVar96);
      auVar97._0_4_ =
           (uint)(bVar55 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar55 & 1) * local_3a0._0_4_;
      bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar97._4_4_ = (uint)bVar59 * auVar95._4_4_ | (uint)!bVar59 * local_3a0._4_4_;
      bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar97._8_4_ = (uint)bVar59 * auVar95._8_4_ | (uint)!bVar59 * local_3a0._8_4_;
      bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar97._12_4_ = (uint)bVar59 * auVar95._12_4_ | (uint)!bVar59 * local_3a0._12_4_;
      bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar97._16_4_ = (uint)bVar59 * auVar95._16_4_ | (uint)!bVar59 * local_3a0._16_4_;
      bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar97._20_4_ = (uint)bVar59 * auVar95._20_4_ | (uint)!bVar59 * local_3a0._20_4_;
      bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar97._24_4_ = (uint)bVar59 * auVar95._24_4_ | (uint)!bVar59 * local_3a0._24_4_;
      bVar59 = SUB81(uVar61 >> 7,0);
      auVar97._28_4_ = (uint)bVar59 * auVar95._28_4_ | (uint)!bVar59 * local_3a0._28_4_;
      auVar189._8_4_ = 0xff800000;
      auVar189._0_8_ = 0xff800000ff800000;
      auVar189._12_4_ = 0xff800000;
      auVar189._16_4_ = 0xff800000;
      auVar189._20_4_ = 0xff800000;
      auVar189._24_4_ = 0xff800000;
      auVar189._28_4_ = 0xff800000;
      auVar95 = vblendmps_avx512vl(auVar189,auVar94);
      auVar98._0_4_ = (uint)(bVar55 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar94._0_4_
      ;
      bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
      auVar98._4_4_ = (uint)bVar59 * auVar95._4_4_ | (uint)!bVar59 * auVar94._4_4_;
      bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
      auVar98._8_4_ = (uint)bVar59 * auVar95._8_4_ | (uint)!bVar59 * auVar94._8_4_;
      bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
      auVar98._12_4_ = (uint)bVar59 * auVar95._12_4_ | (uint)!bVar59 * auVar94._12_4_;
      bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
      auVar98._16_4_ = (uint)bVar59 * auVar95._16_4_ | (uint)!bVar59 * auVar94._16_4_;
      bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
      auVar98._20_4_ = (uint)bVar59 * auVar95._20_4_ | (uint)!bVar59 * auVar94._20_4_;
      bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
      auVar98._24_4_ = (uint)bVar59 * auVar95._24_4_ | (uint)!bVar59 * auVar94._24_4_;
      bVar59 = SUB81(uVar61 >> 7,0);
      auVar98._28_4_ = (uint)bVar59 * auVar95._28_4_ | (uint)!bVar59 * auVar94._28_4_;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar91,auVar94);
      auVar95 = vmaxps_avx512vl(local_320,auVar94);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      auVar95 = vmulps_avx512vl(auVar95,auVar29);
      vandps_avx512vl(auVar74,auVar94);
      uVar52 = vcmpps_avx512vl(auVar95,auVar95,1);
      uVar61 = uVar61 & uVar52;
      bVar57 = (byte)uVar61;
      if (bVar57 != 0) {
        uVar52 = vcmpps_avx512vl(auVar76,_DAT_02020f00,2);
        auVar204._8_4_ = 0xff800000;
        auVar204._0_8_ = 0xff800000ff800000;
        auVar204._12_4_ = 0xff800000;
        auVar204._16_4_ = 0xff800000;
        auVar204._20_4_ = 0xff800000;
        auVar204._24_4_ = 0xff800000;
        auVar204._28_4_ = 0xff800000;
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar94 = vblendmps_avx512vl(auVar76,auVar204);
        bVar54 = (byte)uVar52;
        uVar62 = (uint)(bVar54 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar95._0_4_;
        bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
        uVar116 = (uint)bVar59 * auVar94._4_4_ | (uint)!bVar59 * auVar95._4_4_;
        bVar59 = (bool)((byte)(uVar52 >> 2) & 1);
        uVar117 = (uint)bVar59 * auVar94._8_4_ | (uint)!bVar59 * auVar95._8_4_;
        bVar59 = (bool)((byte)(uVar52 >> 3) & 1);
        uVar118 = (uint)bVar59 * auVar94._12_4_ | (uint)!bVar59 * auVar95._12_4_;
        bVar59 = (bool)((byte)(uVar52 >> 4) & 1);
        uVar119 = (uint)bVar59 * auVar94._16_4_ | (uint)!bVar59 * auVar95._16_4_;
        bVar59 = (bool)((byte)(uVar52 >> 5) & 1);
        uVar120 = (uint)bVar59 * auVar94._20_4_ | (uint)!bVar59 * auVar95._20_4_;
        bVar59 = (bool)((byte)(uVar52 >> 6) & 1);
        uVar121 = (uint)bVar59 * auVar94._24_4_ | (uint)!bVar59 * auVar95._24_4_;
        bVar59 = SUB81(uVar52 >> 7,0);
        uVar122 = (uint)bVar59 * auVar94._28_4_ | (uint)!bVar59 * auVar95._28_4_;
        auVar97._0_4_ = (bVar57 & 1) * uVar62 | !(bool)(bVar57 & 1) * auVar97._0_4_;
        bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar97._4_4_ = bVar59 * uVar116 | !bVar59 * auVar97._4_4_;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar97._8_4_ = bVar59 * uVar117 | !bVar59 * auVar97._8_4_;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar97._12_4_ = bVar59 * uVar118 | !bVar59 * auVar97._12_4_;
        bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar97._16_4_ = bVar59 * uVar119 | !bVar59 * auVar97._16_4_;
        bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar97._20_4_ = bVar59 * uVar120 | !bVar59 * auVar97._20_4_;
        bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar97._24_4_ = bVar59 * uVar121 | !bVar59 * auVar97._24_4_;
        bVar59 = SUB81(uVar61 >> 7,0);
        auVar97._28_4_ = bVar59 * uVar122 | !bVar59 * auVar97._28_4_;
        auVar76 = vblendmps_avx512vl(auVar204,auVar76);
        bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar52 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar52 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar52 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar52 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar52 >> 6) & 1);
        bVar16 = SUB81(uVar52 >> 7,0);
        auVar98._0_4_ =
             (uint)(bVar57 & 1) *
             ((uint)(bVar54 & 1) * auVar76._0_4_ | !(bool)(bVar54 & 1) * uVar62) |
             !(bool)(bVar57 & 1) * auVar98._0_4_;
        bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar98._4_4_ =
             (uint)bVar10 * ((uint)bVar59 * auVar76._4_4_ | !bVar59 * uVar116) |
             !bVar10 * auVar98._4_4_;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar98._8_4_ =
             (uint)bVar59 * ((uint)bVar11 * auVar76._8_4_ | !bVar11 * uVar117) |
             !bVar59 * auVar98._8_4_;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar98._12_4_ =
             (uint)bVar59 * ((uint)bVar12 * auVar76._12_4_ | !bVar12 * uVar118) |
             !bVar59 * auVar98._12_4_;
        bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar98._16_4_ =
             (uint)bVar59 * ((uint)bVar13 * auVar76._16_4_ | !bVar13 * uVar119) |
             !bVar59 * auVar98._16_4_;
        bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar98._20_4_ =
             (uint)bVar59 * ((uint)bVar14 * auVar76._20_4_ | !bVar14 * uVar120) |
             !bVar59 * auVar98._20_4_;
        bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar98._24_4_ =
             (uint)bVar59 * ((uint)bVar15 * auVar76._24_4_ | !bVar15 * uVar121) |
             !bVar59 * auVar98._24_4_;
        bVar59 = SUB81(uVar61 >> 7,0);
        auVar98._28_4_ =
             (uint)bVar59 * ((uint)bVar16 * auVar76._28_4_ | !bVar16 * uVar122) |
             !bVar59 * auVar98._28_4_;
        bVar55 = (~bVar57 | bVar54) & bVar55;
      }
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = &DAT_3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar131._16_4_ = 0x3f800000;
      auVar131._20_4_ = 0x3f800000;
      auVar131._24_4_ = 0x3f800000;
      auVar131._28_4_ = 0x3f800000;
    }
    fVar217 = (float)local_580._0_4_;
    fVar208 = (float)local_580._4_4_;
    fVar212 = fStack_578;
    fVar213 = fStack_574;
    fVar214 = fStack_570;
    fVar215 = fStack_56c;
    fVar216 = fStack_568;
    fVar160 = fStack_564;
    if ((bVar55 & 0x7f) == 0) {
LAB_01b4aae7:
      auVar240 = ZEXT3264(auVar99);
      auVar230 = ZEXT3264(auVar83);
      auVar193 = ZEXT3264(auVar131);
      auVar255 = ZEXT3264(local_7a0);
      auVar259 = ZEXT3264(local_7c0);
      auVar248 = ZEXT3264(local_7e0);
      auVar249 = ZEXT3264(local_600);
      auVar250 = ZEXT3264(local_620);
      auVar251 = ZEXT3264(local_800);
      auVar252 = ZEXT3264(local_640);
      auVar253 = ZEXT3264(local_660);
      auVar254 = ZEXT3264(local_820);
      auVar256 = ZEXT3264(local_680);
      auVar257 = ZEXT3264(local_6a0);
      auVar258 = ZEXT3264(local_6c0);
      auVar261 = ZEXT3264(local_6e0);
    }
    else {
      auVar66 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_490);
      auVar190._0_4_ = auVar66._0_4_;
      auVar190._4_4_ = auVar190._0_4_;
      auVar190._8_4_ = auVar190._0_4_;
      auVar190._12_4_ = auVar190._0_4_;
      auVar190._16_4_ = auVar190._0_4_;
      auVar190._20_4_ = auVar190._0_4_;
      auVar190._24_4_ = auVar190._0_4_;
      auVar190._28_4_ = auVar190._0_4_;
      auVar76 = vmaxps_avx512vl(auVar190,auVar97);
      auVar66 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_490);
      auVar202._0_4_ = auVar66._0_4_;
      auVar202._4_4_ = auVar202._0_4_;
      auVar202._8_4_ = auVar202._0_4_;
      auVar202._12_4_ = auVar202._0_4_;
      auVar202._16_4_ = auVar202._0_4_;
      auVar202._20_4_ = auVar202._0_4_;
      auVar202._24_4_ = auVar202._0_4_;
      auVar202._28_4_ = auVar202._0_4_;
      auVar94 = vminps_avx512vl(auVar202,auVar98);
      auVar82 = vmulps_avx512vl(auVar82,auVar101);
      auVar81 = vfmadd213ps_avx512vl(auVar81,auVar100,auVar82);
      auVar80 = vfmadd213ps_avx512vl(auVar80,auVar99,auVar81);
      auVar50._4_4_ = uStack_2fc;
      auVar50._0_4_ = local_300;
      auVar50._8_4_ = uStack_2f8;
      auVar50._12_4_ = uStack_2f4;
      auVar50._16_4_ = uStack_2f0;
      auVar50._20_4_ = uStack_2ec;
      auVar50._24_4_ = uStack_2e8;
      auVar50._28_4_ = uStack_2e4;
      auVar81 = vmulps_avx512vl(auVar50,auVar101);
      auVar81 = vfmadd231ps_avx512vl(auVar81,local_7c0,auVar100);
      auVar81 = vfmadd231ps_avx512vl(auVar81,local_7a0,auVar99);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar81,auVar99);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar19 = vcmpps_avx512vl(auVar99,auVar100,1);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar80 = vxorps_avx512vl(auVar80,auVar101);
      auVar82 = vrcp14ps_avx512vl(auVar81);
      auVar95 = vxorps_avx512vl(auVar81,auVar101);
      auVar96 = vfnmadd213ps_avx512vl(auVar82,auVar81,auVar131);
      auVar96 = vfmadd132ps_avx512vl(auVar96,auVar82,auVar82);
      auVar80 = vmulps_avx512vl(auVar96,auVar80);
      uVar20 = vcmpps_avx512vl(auVar81,auVar95,1);
      bVar57 = (byte)uVar19 | (byte)uVar20;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar80,auVar96);
      auVar103._0_4_ =
           (uint)(bVar57 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar82._0_4_;
      bVar59 = (bool)(bVar57 >> 1 & 1);
      auVar103._4_4_ = (uint)bVar59 * auVar102._4_4_ | (uint)!bVar59 * auVar82._4_4_;
      bVar59 = (bool)(bVar57 >> 2 & 1);
      auVar103._8_4_ = (uint)bVar59 * auVar102._8_4_ | (uint)!bVar59 * auVar82._8_4_;
      bVar59 = (bool)(bVar57 >> 3 & 1);
      auVar103._12_4_ = (uint)bVar59 * auVar102._12_4_ | (uint)!bVar59 * auVar82._12_4_;
      bVar59 = (bool)(bVar57 >> 4 & 1);
      auVar103._16_4_ = (uint)bVar59 * auVar102._16_4_ | (uint)!bVar59 * auVar82._16_4_;
      bVar59 = (bool)(bVar57 >> 5 & 1);
      auVar103._20_4_ = (uint)bVar59 * auVar102._20_4_ | (uint)!bVar59 * auVar82._20_4_;
      bVar59 = (bool)(bVar57 >> 6 & 1);
      auVar103._24_4_ = (uint)bVar59 * auVar102._24_4_ | (uint)!bVar59 * auVar82._24_4_;
      auVar103._28_4_ =
           (uint)(bVar57 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar82._28_4_;
      auVar76 = vmaxps_avx(auVar76,auVar103);
      uVar20 = vcmpps_avx512vl(auVar81,auVar95,6);
      bVar57 = (byte)uVar19 | (byte)uVar20;
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar104._0_4_ =
           (uint)(bVar57 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar80._0_4_;
      bVar59 = (bool)(bVar57 >> 1 & 1);
      auVar104._4_4_ = (uint)bVar59 * auVar95._4_4_ | (uint)!bVar59 * auVar80._4_4_;
      bVar59 = (bool)(bVar57 >> 2 & 1);
      auVar104._8_4_ = (uint)bVar59 * auVar95._8_4_ | (uint)!bVar59 * auVar80._8_4_;
      bVar59 = (bool)(bVar57 >> 3 & 1);
      auVar104._12_4_ = (uint)bVar59 * auVar95._12_4_ | (uint)!bVar59 * auVar80._12_4_;
      bVar59 = (bool)(bVar57 >> 4 & 1);
      auVar104._16_4_ = (uint)bVar59 * auVar95._16_4_ | (uint)!bVar59 * auVar80._16_4_;
      bVar59 = (bool)(bVar57 >> 5 & 1);
      auVar104._20_4_ = (uint)bVar59 * auVar95._20_4_ | (uint)!bVar59 * auVar80._20_4_;
      bVar59 = (bool)(bVar57 >> 6 & 1);
      auVar104._24_4_ = (uint)bVar59 * auVar95._24_4_ | (uint)!bVar59 * auVar80._24_4_;
      auVar104._28_4_ =
           (uint)(bVar57 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar80._28_4_;
      auVar80 = vminps_avx(auVar94,auVar104);
      auVar81 = vsubps_avx(ZEXT832(0) << 0x20,local_900);
      auVar82 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
      auVar94 = ZEXT832(0) << 0x20;
      auVar78 = vsubps_avx(auVar94,auVar78);
      auVar37._4_4_ = auVar78._4_4_ * auVar86._4_4_;
      auVar37._0_4_ = auVar78._0_4_ * auVar86._0_4_;
      auVar37._8_4_ = auVar78._8_4_ * auVar86._8_4_;
      auVar37._12_4_ = auVar78._12_4_ * auVar86._12_4_;
      auVar37._16_4_ = auVar78._16_4_ * auVar86._16_4_;
      auVar37._20_4_ = auVar78._20_4_ * auVar86._20_4_;
      auVar37._24_4_ = auVar78._24_4_ * auVar86._24_4_;
      auVar37._28_4_ = auVar78._28_4_;
      auVar78 = vfnmsub231ps_avx512vl(auVar37,auVar85,auVar82);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar84,auVar81);
      auVar81 = vmulps_avx512vl(auVar50,auVar86);
      auVar81 = vfnmsub231ps_avx512vl(auVar81,local_7c0,auVar85);
      auVar81 = vfnmadd231ps_avx512vl(auVar81,local_7a0,auVar84);
      vandps_avx512vl(auVar81,auVar99);
      uVar19 = vcmpps_avx512vl(auVar81,auVar100,1);
      auVar78 = vxorps_avx512vl(auVar78,auVar101);
      auVar82 = vrcp14ps_avx512vl(auVar81);
      auVar99 = vxorps_avx512vl(auVar81,auVar101);
      auVar84 = vfnmadd213ps_avx512vl(auVar82,auVar81,auVar131);
      auVar66 = vfmadd132ps_fma(auVar84,auVar82,auVar82);
      auVar244 = ZEXT1664(auVar66);
      fVar229 = auVar66._0_4_ * auVar78._0_4_;
      fVar232 = auVar66._4_4_ * auVar78._4_4_;
      auVar38._4_4_ = fVar232;
      auVar38._0_4_ = fVar229;
      fVar234 = auVar66._8_4_ * auVar78._8_4_;
      auVar38._8_4_ = fVar234;
      fVar236 = auVar66._12_4_ * auVar78._12_4_;
      auVar38._12_4_ = fVar236;
      fVar237 = auVar78._16_4_ * 0.0;
      auVar38._16_4_ = fVar237;
      fVar228 = auVar78._20_4_ * 0.0;
      auVar38._20_4_ = fVar228;
      fVar231 = auVar78._24_4_ * 0.0;
      auVar38._24_4_ = fVar231;
      auVar38._28_4_ = auVar78._28_4_;
      uVar20 = vcmpps_avx512vl(auVar81,auVar99,1);
      bVar57 = (byte)uVar19 | (byte)uVar20;
      auVar84 = vblendmps_avx512vl(auVar38,auVar96);
      auVar105._0_4_ =
           (uint)(bVar57 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar82._0_4_;
      bVar59 = (bool)(bVar57 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar59 * auVar84._4_4_ | (uint)!bVar59 * auVar82._4_4_;
      bVar59 = (bool)(bVar57 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar59 * auVar84._8_4_ | (uint)!bVar59 * auVar82._8_4_;
      bVar59 = (bool)(bVar57 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar59 * auVar84._12_4_ | (uint)!bVar59 * auVar82._12_4_;
      bVar59 = (bool)(bVar57 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar59 * auVar84._16_4_ | (uint)!bVar59 * auVar82._16_4_;
      bVar59 = (bool)(bVar57 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar59 * auVar84._20_4_ | (uint)!bVar59 * auVar82._20_4_;
      bVar59 = (bool)(bVar57 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar59 * auVar84._24_4_ | (uint)!bVar59 * auVar82._24_4_;
      auVar105._28_4_ =
           (uint)(bVar57 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar82._28_4_;
      _local_420 = vmaxps_avx(auVar76,auVar105);
      uVar20 = vcmpps_avx512vl(auVar81,auVar99,6);
      bVar57 = (byte)uVar19 | (byte)uVar20;
      auVar83._0_4_ = (uint)(bVar57 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar57 & 1) * (int)fVar229;
      bVar59 = (bool)(bVar57 >> 1 & 1);
      auVar83._4_4_ = (uint)bVar59 * auVar95._4_4_ | (uint)!bVar59 * (int)fVar232;
      bVar59 = (bool)(bVar57 >> 2 & 1);
      auVar83._8_4_ = (uint)bVar59 * auVar95._8_4_ | (uint)!bVar59 * (int)fVar234;
      bVar59 = (bool)(bVar57 >> 3 & 1);
      auVar83._12_4_ = (uint)bVar59 * auVar95._12_4_ | (uint)!bVar59 * (int)fVar236;
      bVar59 = (bool)(bVar57 >> 4 & 1);
      auVar83._16_4_ = (uint)bVar59 * auVar95._16_4_ | (uint)!bVar59 * (int)fVar237;
      bVar59 = (bool)(bVar57 >> 5 & 1);
      auVar83._20_4_ = (uint)bVar59 * auVar95._20_4_ | (uint)!bVar59 * (int)fVar228;
      bVar59 = (bool)(bVar57 >> 6 & 1);
      auVar83._24_4_ = (uint)bVar59 * auVar95._24_4_ | (uint)!bVar59 * (int)fVar231;
      auVar83._28_4_ =
           (uint)(bVar57 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar78._28_4_;
      local_260 = vminps_avx(auVar80,auVar83);
      auVar227 = ZEXT3264(local_260);
      uVar19 = vcmpps_avx512vl(_local_420,local_260,2);
      bVar55 = bVar55 & 0x7f & (byte)uVar19;
      if (bVar55 == 0) goto LAB_01b4aae7;
      auVar76 = vmaxps_avx(auVar94,local_8c0);
      auVar78 = vminps_avx512vl(local_380,auVar131);
      auVar44 = ZEXT412(0);
      auVar80 = ZEXT1232(auVar44) << 0x20;
      auVar78 = vmaxps_avx(auVar78,ZEXT1232(auVar44) << 0x20);
      auVar81 = vminps_avx512vl(local_3a0,auVar131);
      auVar39._4_4_ = (auVar78._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar78._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar78._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar78._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar78._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar78._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar78._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar78._28_4_ + 7.0;
      auVar66 = vfmadd213ps_fma(auVar39,local_8a0,local_780);
      local_380 = ZEXT1632(auVar66);
      auVar78 = vmaxps_avx(auVar81,ZEXT1232(auVar44) << 0x20);
      auVar40._4_4_ = (auVar78._4_4_ + 1.0) * 0.125;
      auVar40._0_4_ = (auVar78._0_4_ + 0.0) * 0.125;
      auVar40._8_4_ = (auVar78._8_4_ + 2.0) * 0.125;
      auVar40._12_4_ = (auVar78._12_4_ + 3.0) * 0.125;
      auVar40._16_4_ = (auVar78._16_4_ + 4.0) * 0.125;
      auVar40._20_4_ = (auVar78._20_4_ + 5.0) * 0.125;
      auVar40._24_4_ = (auVar78._24_4_ + 6.0) * 0.125;
      auVar40._28_4_ = auVar78._28_4_ + 7.0;
      auVar66 = vfmadd213ps_fma(auVar40,local_8a0,local_780);
      local_3a0 = ZEXT1632(auVar66);
      auVar191._0_4_ = auVar76._0_4_ * auVar76._0_4_;
      auVar191._4_4_ = auVar76._4_4_ * auVar76._4_4_;
      auVar191._8_4_ = auVar76._8_4_ * auVar76._8_4_;
      auVar191._12_4_ = auVar76._12_4_ * auVar76._12_4_;
      auVar191._16_4_ = auVar76._16_4_ * auVar76._16_4_;
      auVar191._20_4_ = auVar76._20_4_ * auVar76._20_4_;
      auVar191._24_4_ = auVar76._24_4_ * auVar76._24_4_;
      auVar191._28_4_ = 0;
      auVar76 = vsubps_avx(auVar88,auVar191);
      auVar78 = vmulps_avx512vl(auVar87,auVar76);
      auVar78 = vsubps_avx512vl(auVar93,auVar78);
      uVar19 = vcmpps_avx512vl(auVar78,ZEXT1232(auVar44) << 0x20,5);
      bVar57 = (byte)uVar19;
      auVar252 = ZEXT3264(local_640);
      auVar253 = ZEXT3264(local_660);
      auVar256 = ZEXT3264(local_680);
      auVar257 = ZEXT3264(local_6a0);
      auVar258 = ZEXT3264(local_6c0);
      auVar261 = ZEXT3264(local_6e0);
      if (bVar57 == 0) {
        auVar77 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar244 = ZEXT864(0) << 0x20;
        auVar78 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar81 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar230 = ZEXT864(0) << 0x20;
        auVar106._8_4_ = 0x7f800000;
        auVar106._0_8_ = 0x7f8000007f800000;
        auVar106._12_4_ = 0x7f800000;
        auVar106._16_4_ = 0x7f800000;
        auVar106._20_4_ = 0x7f800000;
        auVar106._24_4_ = 0x7f800000;
        auVar106._28_4_ = 0x7f800000;
        auVar107._8_4_ = 0xff800000;
        auVar107._0_8_ = 0xff800000ff800000;
        auVar107._12_4_ = 0xff800000;
        auVar107._16_4_ = 0xff800000;
        auVar107._20_4_ = 0xff800000;
        auVar107._24_4_ = 0xff800000;
        auVar107._28_4_ = 0xff800000;
      }
      else {
        auVar68 = vxorps_avx512vl(auVar85._0_16_,auVar85._0_16_);
        uVar61 = vcmpps_avx512vl(auVar78,auVar94,5);
        auVar78 = vsqrtps_avx(auVar78);
        auVar203._0_4_ = auVar74._0_4_ + auVar74._0_4_;
        auVar203._4_4_ = auVar74._4_4_ + auVar74._4_4_;
        auVar203._8_4_ = auVar74._8_4_ + auVar74._8_4_;
        auVar203._12_4_ = auVar74._12_4_ + auVar74._12_4_;
        auVar203._16_4_ = auVar74._16_4_ + auVar74._16_4_;
        auVar203._20_4_ = auVar74._20_4_ + auVar74._20_4_;
        auVar203._24_4_ = auVar74._24_4_ + auVar74._24_4_;
        auVar203._28_4_ = auVar74._28_4_ + auVar74._28_4_;
        auVar80 = vrcp14ps_avx512vl(auVar203);
        auVar81 = vfnmadd213ps_avx512vl(auVar203,auVar80,auVar131);
        auVar66 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
        auVar30._8_4_ = 0x80000000;
        auVar30._0_8_ = 0x8000000080000000;
        auVar30._12_4_ = 0x80000000;
        auVar30._16_4_ = 0x80000000;
        auVar30._20_4_ = 0x80000000;
        auVar30._24_4_ = 0x80000000;
        auVar30._28_4_ = 0x80000000;
        auVar80 = vxorps_avx512vl(auVar92,auVar30);
        auVar80 = vsubps_avx(auVar80,auVar78);
        auVar41._4_4_ = auVar80._4_4_ * auVar66._4_4_;
        auVar41._0_4_ = auVar80._0_4_ * auVar66._0_4_;
        auVar41._8_4_ = auVar80._8_4_ * auVar66._8_4_;
        auVar41._12_4_ = auVar80._12_4_ * auVar66._12_4_;
        auVar41._16_4_ = auVar80._16_4_ * 0.0;
        auVar41._20_4_ = auVar80._20_4_ * 0.0;
        auVar41._24_4_ = auVar80._24_4_ * 0.0;
        auVar41._28_4_ = 0x3e000000;
        auVar78 = vsubps_avx512vl(auVar78,auVar92);
        auVar245._0_4_ = auVar78._0_4_ * auVar66._0_4_;
        auVar245._4_4_ = auVar78._4_4_ * auVar66._4_4_;
        auVar245._8_4_ = auVar78._8_4_ * auVar66._8_4_;
        auVar245._12_4_ = auVar78._12_4_ * auVar66._12_4_;
        auVar245._16_4_ = auVar78._16_4_ * 0.0;
        auVar245._20_4_ = auVar78._20_4_ * 0.0;
        auVar245._24_4_ = auVar78._24_4_ * 0.0;
        auVar245._28_4_ = 0;
        auVar78 = vfmadd213ps_avx512vl(auVar89,auVar41,auVar90);
        auVar42._4_4_ = auVar79._4_4_ * auVar78._4_4_;
        auVar42._0_4_ = auVar79._0_4_ * auVar78._0_4_;
        auVar42._8_4_ = auVar79._8_4_ * auVar78._8_4_;
        auVar42._12_4_ = auVar79._12_4_ * auVar78._12_4_;
        auVar42._16_4_ = auVar79._16_4_ * auVar78._16_4_;
        auVar42._20_4_ = auVar79._20_4_ * auVar78._20_4_;
        auVar42._24_4_ = auVar79._24_4_ * auVar78._24_4_;
        auVar42._28_4_ = auVar80._28_4_;
        auVar78 = vmulps_avx512vl(local_7a0,auVar41);
        auVar80 = vmulps_avx512vl(local_7c0,auVar41);
        auVar82 = vmulps_avx512vl(auVar50,auVar41);
        auVar81 = vfmadd213ps_avx512vl(auVar77,auVar42,local_400);
        auVar78 = vsubps_avx512vl(auVar78,auVar81);
        auVar81 = vfmadd213ps_avx512vl(auVar75,auVar42,local_700);
        auVar81 = vsubps_avx512vl(auVar80,auVar81);
        auVar66 = vfmadd213ps_fma(auVar42,local_720,local_4e0);
        auVar80 = vsubps_avx(auVar82,ZEXT1632(auVar66));
        auVar230 = ZEXT3264(auVar80);
        auVar80 = vfmadd213ps_avx512vl(auVar89,auVar245,auVar90);
        auVar79 = vmulps_avx512vl(auVar79,auVar80);
        auVar80 = vmulps_avx512vl(local_7a0,auVar245);
        auVar82 = vmulps_avx512vl(local_7c0,auVar245);
        auVar87 = vmulps_avx512vl(auVar50,auVar245);
        auVar66 = vfmadd213ps_fma(auVar77,auVar79,local_400);
        auVar80 = vsubps_avx(auVar80,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(auVar75,auVar79,local_700);
        auVar77 = vsubps_avx512vl(auVar82,ZEXT1632(auVar66));
        auVar66 = vfmadd213ps_fma(local_720,auVar79,local_4e0);
        auVar75 = vsubps_avx512vl(auVar87,ZEXT1632(auVar66));
        auVar244 = ZEXT3264(auVar75);
        auVar132._8_4_ = 0x7f800000;
        auVar132._0_8_ = 0x7f8000007f800000;
        auVar132._12_4_ = 0x7f800000;
        auVar132._16_4_ = 0x7f800000;
        auVar132._20_4_ = 0x7f800000;
        auVar132._24_4_ = 0x7f800000;
        auVar132._28_4_ = 0x7f800000;
        auVar75 = vblendmps_avx512vl(auVar132,auVar41);
        bVar59 = (bool)((byte)uVar61 & 1);
        auVar106._0_4_ = (uint)bVar59 * auVar75._0_4_ | (uint)!bVar59 * auVar67._0_4_;
        bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar106._4_4_ = (uint)bVar59 * auVar75._4_4_ | (uint)!bVar59 * auVar67._4_4_;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar106._8_4_ = (uint)bVar59 * auVar75._8_4_ | (uint)!bVar59 * auVar67._8_4_;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar106._12_4_ = (uint)bVar59 * auVar75._12_4_ | (uint)!bVar59 * auVar67._12_4_;
        iVar1 = (uint)((byte)(uVar61 >> 4) & 1) * auVar75._16_4_;
        auVar106._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar61 >> 5) & 1) * auVar75._20_4_;
        auVar106._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar61 >> 6) & 1) * auVar75._24_4_;
        auVar106._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar61 >> 7) * auVar75._28_4_;
        auVar106._28_4_ = iVar4;
        auVar133._8_4_ = 0xff800000;
        auVar133._0_8_ = 0xff800000ff800000;
        auVar133._12_4_ = 0xff800000;
        auVar133._16_4_ = 0xff800000;
        auVar133._20_4_ = 0xff800000;
        auVar133._24_4_ = 0xff800000;
        auVar133._28_4_ = 0xff800000;
        auVar75 = vblendmps_avx512vl(auVar133,auVar245);
        bVar59 = (bool)((byte)uVar61 & 1);
        auVar107._0_4_ = (uint)bVar59 * auVar75._0_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar59 * auVar75._4_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar59 * auVar75._8_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar59 * auVar75._12_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar107._16_4_ = (uint)bVar59 * auVar75._16_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar107._20_4_ = (uint)bVar59 * auVar75._20_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar107._24_4_ = (uint)bVar59 * auVar75._24_4_ | (uint)!bVar59 * -0x800000;
        bVar59 = SUB81(uVar61 >> 7,0);
        auVar107._28_4_ = (uint)bVar59 * auVar75._28_4_ | (uint)!bVar59 * -0x800000;
        auVar221._8_4_ = 0x7fffffff;
        auVar221._0_8_ = 0x7fffffff7fffffff;
        auVar221._12_4_ = 0x7fffffff;
        auVar221._16_4_ = 0x7fffffff;
        auVar221._20_4_ = 0x7fffffff;
        auVar221._24_4_ = 0x7fffffff;
        auVar221._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar91,auVar221);
        auVar75 = vmaxps_avx(local_320,auVar107);
        auVar31._8_4_ = 0x36000000;
        auVar31._0_8_ = 0x3600000036000000;
        auVar31._12_4_ = 0x36000000;
        auVar31._16_4_ = 0x36000000;
        auVar31._20_4_ = 0x36000000;
        auVar31._24_4_ = 0x36000000;
        auVar31._28_4_ = 0x36000000;
        auVar75 = vmulps_avx512vl(auVar75,auVar31);
        auVar74 = vandps_avx(auVar74,auVar221);
        uVar52 = vcmpps_avx512vl(auVar74,auVar75,1);
        uVar61 = uVar61 & uVar52;
        bVar54 = (byte)uVar61;
        if (bVar54 != 0) {
          uVar52 = vcmpps_avx512vl(auVar76,ZEXT1632(auVar68),2);
          auVar222._8_4_ = 0xff800000;
          auVar222._0_8_ = 0xff800000ff800000;
          auVar222._12_4_ = 0xff800000;
          auVar222._16_4_ = 0xff800000;
          auVar222._20_4_ = 0xff800000;
          auVar222._24_4_ = 0xff800000;
          auVar222._28_4_ = 0xff800000;
          auVar239._8_4_ = 0x7f800000;
          auVar239._0_8_ = 0x7f8000007f800000;
          auVar239._12_4_ = 0x7f800000;
          auVar239._16_4_ = 0x7f800000;
          auVar239._20_4_ = 0x7f800000;
          auVar239._24_4_ = 0x7f800000;
          auVar239._28_4_ = 0x7f800000;
          auVar74 = vblendmps_avx512vl(auVar239,auVar222);
          bVar51 = (byte)uVar52;
          uVar62 = (uint)(bVar51 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar75._0_4_;
          bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
          uVar116 = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * auVar75._4_4_;
          bVar59 = (bool)((byte)(uVar52 >> 2) & 1);
          uVar117 = (uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * auVar75._8_4_;
          bVar59 = (bool)((byte)(uVar52 >> 3) & 1);
          uVar118 = (uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * auVar75._12_4_;
          bVar59 = (bool)((byte)(uVar52 >> 4) & 1);
          uVar119 = (uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * auVar75._16_4_;
          bVar59 = (bool)((byte)(uVar52 >> 5) & 1);
          uVar120 = (uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * auVar75._20_4_;
          bVar59 = (bool)((byte)(uVar52 >> 6) & 1);
          uVar121 = (uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * auVar75._24_4_;
          bVar59 = SUB81(uVar52 >> 7,0);
          uVar122 = (uint)bVar59 * auVar74._28_4_ | (uint)!bVar59 * auVar75._28_4_;
          auVar106._0_4_ = (bVar54 & 1) * uVar62 | !(bool)(bVar54 & 1) * auVar106._0_4_;
          bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar106._4_4_ = bVar59 * uVar116 | !bVar59 * auVar106._4_4_;
          bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar106._8_4_ = bVar59 * uVar117 | !bVar59 * auVar106._8_4_;
          bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar106._12_4_ = bVar59 * uVar118 | !bVar59 * auVar106._12_4_;
          bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar106._16_4_ = bVar59 * uVar119 | (uint)!bVar59 * iVar1;
          bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar106._20_4_ = bVar59 * uVar120 | (uint)!bVar59 * iVar2;
          bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar106._24_4_ = bVar59 * uVar121 | (uint)!bVar59 * iVar3;
          bVar59 = SUB81(uVar61 >> 7,0);
          auVar106._28_4_ = bVar59 * uVar122 | (uint)!bVar59 * iVar4;
          auVar74 = vblendmps_avx512vl(auVar222,auVar239);
          bVar59 = (bool)((byte)(uVar52 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar52 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar52 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar52 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar52 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar52 >> 6) & 1);
          bVar16 = SUB81(uVar52 >> 7,0);
          auVar107._0_4_ =
               (uint)(bVar54 & 1) *
               ((uint)(bVar51 & 1) * auVar74._0_4_ | !(bool)(bVar51 & 1) * uVar62) |
               !(bool)(bVar54 & 1) * auVar107._0_4_;
          bVar10 = (bool)((byte)(uVar61 >> 1) & 1);
          auVar107._4_4_ =
               (uint)bVar10 * ((uint)bVar59 * auVar74._4_4_ | !bVar59 * uVar116) |
               !bVar10 * auVar107._4_4_;
          bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
          auVar107._8_4_ =
               (uint)bVar59 * ((uint)bVar11 * auVar74._8_4_ | !bVar11 * uVar117) |
               !bVar59 * auVar107._8_4_;
          bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
          auVar107._12_4_ =
               (uint)bVar59 * ((uint)bVar12 * auVar74._12_4_ | !bVar12 * uVar118) |
               !bVar59 * auVar107._12_4_;
          bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
          auVar107._16_4_ =
               (uint)bVar59 * ((uint)bVar13 * auVar74._16_4_ | !bVar13 * uVar119) |
               !bVar59 * auVar107._16_4_;
          bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
          auVar107._20_4_ =
               (uint)bVar59 * ((uint)bVar14 * auVar74._20_4_ | !bVar14 * uVar120) |
               !bVar59 * auVar107._20_4_;
          bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
          auVar107._24_4_ =
               (uint)bVar59 * ((uint)bVar15 * auVar74._24_4_ | !bVar15 * uVar121) |
               !bVar59 * auVar107._24_4_;
          bVar59 = SUB81(uVar61 >> 7,0);
          auVar107._28_4_ =
               (uint)bVar59 * ((uint)bVar16 * auVar74._28_4_ | !bVar16 * uVar122) |
               !bVar59 * auVar107._28_4_;
          bVar57 = (~bVar54 | bVar51) & bVar57;
        }
      }
      auVar259 = ZEXT3264(local_7c0);
      auVar255 = ZEXT3264(local_7a0);
      auVar248 = ZEXT3264(local_7e0);
      auVar251 = ZEXT3264(local_800);
      auVar254 = ZEXT3264(local_820);
      uVar224 = *(undefined4 *)&(ray->dir).field_0;
      auVar211._4_4_ = uVar224;
      auVar211._0_4_ = uVar224;
      auVar211._8_4_ = uVar224;
      auVar211._12_4_ = uVar224;
      auVar211._16_4_ = uVar224;
      auVar211._20_4_ = uVar224;
      auVar211._24_4_ = uVar224;
      auVar211._28_4_ = uVar224;
      uVar224 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar223._4_4_ = uVar224;
      auVar223._0_4_ = uVar224;
      auVar223._8_4_ = uVar224;
      auVar223._12_4_ = uVar224;
      auVar223._16_4_ = uVar224;
      auVar223._20_4_ = uVar224;
      auVar223._24_4_ = uVar224;
      auVar223._28_4_ = uVar224;
      fVar229 = (ray->dir).field_0.m128[2];
      auVar240 = ZEXT3264(CONCAT428(fVar229,CONCAT424(fVar229,CONCAT420(fVar229,CONCAT416(fVar229,
                                                  CONCAT412(fVar229,CONCAT48(fVar229,CONCAT44(
                                                  fVar229,fVar229))))))));
      auVar249._0_4_ = fVar229 * auVar244._0_4_;
      auVar249._4_4_ = fVar229 * auVar244._4_4_;
      auVar249._8_4_ = fVar229 * auVar244._8_4_;
      auVar249._12_4_ = fVar229 * auVar244._12_4_;
      auVar249._16_4_ = fVar229 * auVar244._16_4_;
      auVar249._20_4_ = fVar229 * auVar244._20_4_;
      auVar249._28_36_ = auVar244._28_36_;
      auVar249._24_4_ = fVar229 * auVar244._24_4_;
      auVar67 = vfmadd231ps_fma(auVar249._0_32_,auVar223,auVar77);
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar211,auVar80);
      auVar244 = ZEXT3264(_local_420);
      _local_2c0 = _local_420;
      local_2a0 = vminps_avx(local_260,auVar106);
      auVar238._8_4_ = 0x7fffffff;
      auVar238._0_8_ = 0x7fffffff7fffffff;
      auVar238._12_4_ = 0x7fffffff;
      auVar238._16_4_ = 0x7fffffff;
      auVar238._20_4_ = 0x7fffffff;
      auVar238._24_4_ = 0x7fffffff;
      auVar238._28_4_ = 0x7fffffff;
      auVar74 = vandps_avx(auVar238,ZEXT1632(auVar67));
      _local_3e0 = vmaxps_avx(_local_420,auVar107);
      _local_280 = _local_3e0;
      auVar134._8_4_ = 0x3e99999a;
      auVar134._0_8_ = 0x3e99999a3e99999a;
      auVar134._12_4_ = 0x3e99999a;
      auVar134._16_4_ = 0x3e99999a;
      auVar134._20_4_ = 0x3e99999a;
      auVar134._24_4_ = 0x3e99999a;
      auVar134._28_4_ = 0x3e99999a;
      uVar19 = vcmpps_avx512vl(auVar74,auVar134,1);
      local_824 = (undefined4)uVar19;
      uVar19 = vcmpps_avx512vl(_local_420,local_2a0,2);
      bVar54 = (byte)uVar19 & bVar55;
      uVar20 = vcmpps_avx512vl(_local_3e0,local_260,2);
      auVar249 = ZEXT3264(local_600);
      auVar250 = ZEXT3264(local_620);
      if ((bVar55 & ((byte)uVar20 | (byte)uVar19)) == 0) {
        auVar193 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
      else {
        auVar43._4_4_ = auVar230._4_4_ * fVar229;
        auVar43._0_4_ = auVar230._0_4_ * fVar229;
        auVar43._8_4_ = auVar230._8_4_ * fVar229;
        auVar43._12_4_ = auVar230._12_4_ * fVar229;
        auVar43._16_4_ = auVar230._16_4_ * fVar229;
        auVar43._20_4_ = auVar230._20_4_ * fVar229;
        auVar43._24_4_ = auVar230._24_4_ * fVar229;
        auVar43._28_4_ = 0x3e99999a;
        auVar67 = vfmadd213ps_fma(auVar81,auVar223,auVar43);
        auVar67 = vfmadd213ps_fma(auVar78,auVar211,ZEXT1632(auVar67));
        auVar74 = vandps_avx(auVar238,ZEXT1632(auVar67));
        uVar19 = vcmpps_avx512vl(auVar74,auVar134,1);
        local_82c = (uint)(byte)~bVar57;
        bVar57 = (byte)uVar19 | ~bVar57;
        auVar135._8_4_ = 2;
        auVar135._0_8_ = 0x200000002;
        auVar135._12_4_ = 2;
        auVar135._16_4_ = 2;
        auVar135._20_4_ = 2;
        auVar135._24_4_ = 2;
        auVar135._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar74 = vpblendmd_avx512vl(auVar135,auVar32);
        local_240._0_4_ = (uint)(bVar57 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
        bVar59 = (bool)(bVar57 >> 1 & 1);
        local_240._4_4_ = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar57 >> 2 & 1);
        local_240._8_4_ = (uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar57 >> 3 & 1);
        local_240._12_4_ = (uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar57 >> 4 & 1);
        local_240._16_4_ = (uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar57 >> 5 & 1);
        local_240._20_4_ = (uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar57 >> 6 & 1);
        local_240._24_4_ = (uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * 2;
        local_240._28_4_ = (uint)(bVar57 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2;
        local_340 = vpbroadcastd_avx512vl();
        uVar19 = vpcmpd_avx512vl(local_340,local_240,5);
        local_828 = (uint)bVar54;
        bVar54 = (byte)uVar19 & bVar54;
        if (bVar54 == 0) {
          auVar197._8_4_ = 0x7fffffff;
          auVar197._0_8_ = 0x7fffffff7fffffff;
          auVar197._12_4_ = 0x7fffffff;
        }
        else {
          auVar66 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar67 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar68 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar17 = vminps_avx(auVar66,auVar68);
          auVar66 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar68 = vmaxps_avx(auVar67,auVar66);
          auVar163._8_4_ = 0x7fffffff;
          auVar163._0_8_ = 0x7fffffff7fffffff;
          auVar163._12_4_ = 0x7fffffff;
          auVar67 = vandps_avx(auVar17,auVar163);
          auVar66 = vandps_avx(auVar68,auVar163);
          auVar67 = vmaxps_avx(auVar67,auVar66);
          auVar66 = vmovshdup_avx(auVar67);
          auVar66 = vmaxss_avx(auVar66,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar66);
          fVar217 = auVar67._0_4_ * 1.9073486e-06;
          local_4a0 = vshufps_avx(auVar68,auVar68,0xff);
          local_3c0 = (float)local_420._0_4_ + (float)local_580._0_4_;
          fStack_3bc = (float)local_420._4_4_ + (float)local_580._4_4_;
          fStack_3b8 = fStack_418 + fStack_578;
          fStack_3b4 = fStack_414 + fStack_574;
          fStack_3b0 = fStack_410 + fStack_570;
          fStack_3ac = fStack_40c + fStack_56c;
          fStack_3a8 = fStack_408 + fStack_568;
          fStack_3a4 = fStack_404 + fStack_564;
          do {
            auVar77 = local_780;
            auVar136._8_4_ = 0x7f800000;
            auVar136._0_8_ = 0x7f8000007f800000;
            auVar136._12_4_ = 0x7f800000;
            auVar136._16_4_ = 0x7f800000;
            auVar136._20_4_ = 0x7f800000;
            auVar136._24_4_ = 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar74 = vblendmps_avx512vl(auVar136,_local_420);
            auVar108._0_4_ =
                 (uint)(bVar54 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar54 & 1) * 0x7f800000;
            bVar59 = (bool)(bVar54 >> 1 & 1);
            auVar108._4_4_ = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar54 >> 2 & 1);
            auVar108._8_4_ = (uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar54 >> 3 & 1);
            auVar108._12_4_ = (uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar54 >> 4 & 1);
            auVar108._16_4_ = (uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar54 >> 5 & 1);
            auVar108._20_4_ = (uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar54 >> 6 & 1);
            auVar108._24_4_ = (uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * 0x7f800000;
            auVar108._28_4_ =
                 (uint)(bVar54 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar54 >> 7) * 0x7f800000;
            auVar74 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar74 = vminps_avx(auVar108,auVar74);
            auVar76 = vshufpd_avx(auVar74,auVar74,5);
            auVar74 = vminps_avx(auVar74,auVar76);
            auVar76 = vpermpd_avx2(auVar74,0x4e);
            auVar74 = vminps_avx(auVar74,auVar76);
            uVar19 = vcmpps_avx512vl(auVar108,auVar74,0);
            bVar51 = (byte)uVar19 & bVar54;
            bVar57 = bVar54;
            if (bVar51 != 0) {
              bVar57 = bVar51;
            }
            iVar1 = 0;
            for (uVar62 = (uint)bVar57; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            auVar230 = ZEXT464(*(uint *)(local_380 + (uint)(iVar1 << 2)));
            auVar227 = ZEXT464(*(uint *)(local_2c0 + (uint)(iVar1 << 2)));
            aVar5 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar5;
            auVar67 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar67._0_4_ < 0.0) {
              local_900._0_16_ = ZEXT416(*(uint *)(local_380 + (uint)(iVar1 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar1 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar54;
              local_780._2_30_ = auVar77._2_30_;
              fVar208 = sqrtf(auVar67._0_4_);
              bVar54 = local_780[0];
              auVar227 = ZEXT1664(local_8c0._0_16_);
              auVar230 = ZEXT1664(local_900._0_16_);
            }
            else {
              auVar67 = vsqrtss_avx(auVar67,auVar67);
              fVar208 = auVar67._0_4_;
            }
            lVar58 = 5;
            do {
              local_8c0._0_16_ = auVar227._0_16_;
              uVar224 = auVar227._0_4_;
              auVar125._4_4_ = uVar224;
              auVar125._0_4_ = uVar224;
              auVar125._8_4_ = uVar224;
              auVar125._12_4_ = uVar224;
              auVar67 = vfmadd132ps_fma(auVar125,ZEXT816(0) << 0x40,local_4e0._0_16_);
              fVar216 = auVar230._0_4_;
              fVar160 = 1.0 - fVar216;
              fVar212 = fVar216 * fVar216;
              auVar71 = SUB6416(ZEXT464(0x40400000),0);
              auVar70 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar69 = auVar230._0_16_;
              auVar68 = vfmadd213ss_fma(auVar71,auVar69,auVar70);
              auVar66 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar212),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar17 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar160),auVar70);
              auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)(fVar160 * fVar160)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar213 = fVar160 * fVar160 * -fVar216 * 0.5;
              fVar214 = auVar66._0_4_ * 0.5;
              fVar215 = auVar17._0_4_ * 0.5;
              fVar216 = fVar216 * fVar216 * -fVar160 * 0.5;
              auVar183._0_4_ = fVar216 * (float)local_560._0_4_;
              auVar183._4_4_ = fVar216 * (float)local_560._4_4_;
              auVar183._8_4_ = fVar216 * fStack_558;
              auVar183._12_4_ = fVar216 * fStack_554;
              auVar196._4_4_ = fVar215;
              auVar196._0_4_ = fVar215;
              auVar196._8_4_ = fVar215;
              auVar196._12_4_ = fVar215;
              auVar66 = vfmadd132ps_fma(auVar196,auVar183,local_520._0_16_);
              auVar164._4_4_ = fVar214;
              auVar164._0_4_ = fVar214;
              auVar164._8_4_ = fVar214;
              auVar164._12_4_ = fVar214;
              auVar66 = vfmadd132ps_fma(auVar164,auVar66,local_540._0_16_);
              auVar184._4_4_ = fVar213;
              auVar184._0_4_ = fVar213;
              auVar184._8_4_ = fVar213;
              auVar184._12_4_ = fVar213;
              auVar66 = vfmadd132ps_fma(auVar184,auVar66,local_500._0_16_);
              local_430 = vfmadd231ss_fma(auVar70,auVar69,ZEXT416(0x41100000));
              local_440 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar69,ZEXT416(0x40800000)
                                         );
              local_450 = vfmadd213ss_fma(auVar71,auVar69,ZEXT416(0xbf800000));
              local_400._0_16_ = auVar66;
              auVar67 = vsubps_avx(auVar67,auVar66);
              local_780._0_16_ = auVar67;
              auVar67 = vdpps_avx(auVar67,auVar67,0x7f);
              local_900._0_16_ = auVar69;
              local_8a0._0_16_ = auVar67;
              if (auVar67._0_4_ < 0.0) {
                local_700._0_4_ = auVar68._0_4_;
                local_720._0_16_ = ZEXT416((uint)fVar160);
                local_850._0_4_ = fVar212;
                local_860._0_4_ = fVar160 * -2.0;
                auVar240._0_4_ = sqrtf(auVar67._0_4_);
                auVar240._4_60_ = extraout_var;
                auVar68 = ZEXT416((uint)local_700._0_4_);
                auVar67 = auVar240._0_16_;
                auVar66 = local_720._0_16_;
                auVar69 = local_900._0_16_;
              }
              else {
                auVar67 = vsqrtss_avx(auVar67,auVar67);
                local_860._0_4_ = fVar160 * -2.0;
                local_850._0_4_ = fVar212;
                auVar66 = ZEXT416((uint)fVar160);
              }
              fVar213 = auVar66._0_4_;
              fVar212 = auVar69._0_4_;
              auVar70 = vfnmadd231ss_fma(ZEXT416((uint)(fVar212 * (fVar213 + fVar213))),auVar66,
                                         auVar66);
              auVar66 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar212 + fVar212)),
                                        ZEXT416((uint)(fVar212 * fVar212 * 3.0)));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar69,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213 * -3.0)),
                                        ZEXT416((uint)(fVar213 + fVar213)),auVar68);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar69,
                                        ZEXT416((uint)local_850._0_4_));
              fVar212 = auVar70._0_4_ * 0.5;
              fVar213 = auVar66._0_4_ * 0.5;
              fVar214 = auVar17._0_4_ * 0.5;
              fVar215 = auVar68._0_4_ * 0.5;
              auVar185._0_4_ = fVar215 * (float)local_560._0_4_;
              auVar185._4_4_ = fVar215 * (float)local_560._4_4_;
              auVar185._8_4_ = fVar215 * fStack_558;
              auVar185._12_4_ = fVar215 * fStack_554;
              auVar165._4_4_ = fVar214;
              auVar165._0_4_ = fVar214;
              auVar165._8_4_ = fVar214;
              auVar165._12_4_ = fVar214;
              auVar66 = vfmadd132ps_fma(auVar165,auVar185,local_520._0_16_);
              auVar143._4_4_ = fVar213;
              auVar143._0_4_ = fVar213;
              auVar143._8_4_ = fVar213;
              auVar143._12_4_ = fVar213;
              auVar66 = vfmadd132ps_fma(auVar143,auVar66,local_540._0_16_);
              auVar242._4_4_ = fVar212;
              auVar242._0_4_ = fVar212;
              auVar242._8_4_ = fVar212;
              auVar242._12_4_ = fVar212;
              local_700._0_16_ = vfmadd132ps_fma(auVar242,auVar66,local_500._0_16_);
              local_850 = vdpps_avx(local_700._0_16_,local_700._0_16_,0x7f);
              auVar45._12_4_ = 0;
              auVar45._0_12_ = ZEXT812(0);
              fVar212 = local_850._0_4_;
              local_870 = vrsqrt14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar212));
              fVar213 = local_870._0_4_;
              local_860 = vrcp14ss_avx512f(auVar45 << 0x20,ZEXT416((uint)fVar212));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(local_850,auVar23);
              auVar66 = vfnmadd213ss_fma(local_860,local_850,SUB6416(ZEXT464(0x40000000),0));
              local_720._0_4_ = auVar67._0_4_;
              if (fVar212 < auVar68._0_4_) {
                fVar214 = sqrtf(fVar212);
                auVar67 = ZEXT416((uint)local_720._0_4_);
                auVar68 = local_700._0_16_;
              }
              else {
                auVar68 = vsqrtss_avx(local_850,local_850);
                fVar214 = auVar68._0_4_;
                auVar68 = local_700._0_16_;
              }
              fVar215 = local_870._0_4_;
              fVar212 = fVar213 * 1.5 + fVar212 * -0.5 * fVar215 * fVar215 * fVar215;
              local_870._0_4_ = auVar68._0_4_ * fVar212;
              local_870._4_4_ = auVar68._4_4_ * fVar212;
              local_870._8_4_ = auVar68._8_4_ * fVar212;
              local_870._12_4_ = auVar68._12_4_ * fVar212;
              auVar17 = vdpps_avx(local_780._0_16_,local_870,0x7f);
              fVar215 = auVar67._0_4_;
              auVar126._0_4_ = auVar17._0_4_ * auVar17._0_4_;
              auVar126._4_4_ = auVar17._4_4_ * auVar17._4_4_;
              auVar126._8_4_ = auVar17._8_4_ * auVar17._8_4_;
              auVar126._12_4_ = auVar17._12_4_ * auVar17._12_4_;
              auVar70 = vsubps_avx512vl(local_8a0._0_16_,auVar126);
              fVar213 = auVar70._0_4_;
              auVar144._4_12_ = ZEXT812(0) << 0x20;
              auVar144._0_4_ = fVar213;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar144);
              auVar71 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              if (fVar213 < 0.0) {
                local_480 = fVar212;
                fStack_47c = fVar212;
                fStack_478 = fVar212;
                fStack_474 = fVar212;
                local_470 = auVar69;
                local_460 = auVar17;
                fVar216 = sqrtf(fVar213);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar67 = ZEXT416((uint)local_720._0_4_);
                auVar68 = local_700._0_16_;
                auVar17 = local_460;
                auVar69 = local_470;
                fVar212 = local_480;
                fVar160 = fStack_47c;
                fVar229 = fStack_478;
                fVar232 = fStack_474;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
                fVar216 = auVar70._0_4_;
                fVar160 = fVar212;
                fVar229 = fVar212;
                fVar232 = fVar212;
              }
              auVar244 = ZEXT1664(auVar68);
              auVar255 = ZEXT3264(local_7a0);
              auVar259 = ZEXT3264(local_7c0);
              auVar248 = ZEXT3264(local_7e0);
              auVar249 = ZEXT3264(local_600);
              auVar250 = ZEXT3264(local_620);
              auVar251 = ZEXT3264(local_800);
              auVar252 = ZEXT3264(local_640);
              auVar253 = ZEXT3264(local_660);
              auVar254 = ZEXT3264(local_820);
              auVar256 = ZEXT3264(local_680);
              auVar257 = ZEXT3264(local_6a0);
              auVar258 = ZEXT3264(local_6c0);
              auVar261 = ZEXT3264(local_6e0);
              auVar145._0_4_ = (float)local_450._0_4_ * (float)local_560._0_4_;
              auVar145._4_4_ = (float)local_450._0_4_ * (float)local_560._4_4_;
              auVar145._8_4_ = (float)local_450._0_4_ * fStack_558;
              auVar145._12_4_ = (float)local_450._0_4_ * fStack_554;
              auVar166._4_4_ = local_440._0_4_;
              auVar166._0_4_ = local_440._0_4_;
              auVar166._8_4_ = local_440._0_4_;
              auVar166._12_4_ = local_440._0_4_;
              auVar70 = vfmadd132ps_fma(auVar166,auVar145,local_520._0_16_);
              auVar146._4_4_ = local_430._0_4_;
              auVar146._0_4_ = local_430._0_4_;
              auVar146._8_4_ = local_430._0_4_;
              auVar146._12_4_ = local_430._0_4_;
              auVar70 = vfmadd132ps_fma(auVar146,auVar70,local_540._0_16_);
              auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),local_900._0_16_,
                                        ZEXT416(0x40000000));
              auVar167._0_4_ = auVar18._0_4_;
              auVar167._4_4_ = auVar167._0_4_;
              auVar167._8_4_ = auVar167._0_4_;
              auVar167._12_4_ = auVar167._0_4_;
              auVar70 = vfmadd132ps_fma(auVar167,auVar70,local_500._0_16_);
              auVar147._0_4_ = auVar70._0_4_ * (float)local_850._0_4_;
              auVar147._4_4_ = auVar70._4_4_ * (float)local_850._0_4_;
              auVar147._8_4_ = auVar70._8_4_ * (float)local_850._0_4_;
              auVar147._12_4_ = auVar70._12_4_ * (float)local_850._0_4_;
              auVar70 = vdpps_avx(auVar68,auVar70,0x7f);
              fVar234 = auVar70._0_4_;
              auVar168._0_4_ = auVar68._0_4_ * fVar234;
              auVar168._4_4_ = auVar68._4_4_ * fVar234;
              auVar168._8_4_ = auVar68._8_4_ * fVar234;
              auVar168._12_4_ = auVar68._12_4_ * fVar234;
              auVar18 = vsubps_avx(auVar147,auVar168);
              fVar234 = auVar66._0_4_ * (float)local_860._0_4_;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar217),
                                   ZEXT416((uint)((float)local_8c0._0_4_ * fVar208 * 1.9073486e-06))
                                  );
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar110._16_16_ = local_6e0._16_16_;
              auVar72 = vxorps_avx512vl(auVar68,auVar24);
              auVar169._0_4_ = fVar212 * auVar18._0_4_ * fVar234;
              auVar169._4_4_ = fVar160 * auVar18._4_4_ * fVar234;
              auVar169._8_4_ = fVar229 * auVar18._8_4_ * fVar234;
              auVar169._12_4_ = fVar232 * auVar18._12_4_ * fVar234;
              auVar240 = ZEXT1664(local_870);
              auVar66 = vdpps_avx(auVar72,local_870,0x7f);
              auVar18 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar217),auVar70);
              auVar67 = vdpps_avx(local_780._0_16_,auVar169,0x7f);
              auVar18 = vfmadd213ss_fma(ZEXT416((uint)(fVar215 + 1.0)),
                                        ZEXT416((uint)(fVar217 / fVar214)),auVar18);
              fVar212 = auVar66._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_4e0._0_16_,local_870,0x7f);
              auVar66 = vdpps_avx(local_780._0_16_,auVar72,0x7f);
              fVar214 = auVar69._0_4_;
              auVar73 = vaddss_avx512f(auVar71,ZEXT416((uint)(fVar214 * fVar213 * -0.5 *
                                                             fVar214 * fVar214)));
              auVar69 = vdpps_avx(local_780._0_16_,local_4e0._0_16_,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar66,auVar17,ZEXT416((uint)fVar212));
              auVar72 = vfnmadd231ss_fma(auVar69,auVar17,auVar67);
              auVar66 = vpermilps_avx(local_400._0_16_,0xff);
              fVar216 = fVar216 - auVar66._0_4_;
              auVar66 = vshufps_avx(auVar68,auVar68,0xff);
              auVar69 = vfmsub213ss_fma(auVar71,auVar73,auVar66);
              fVar213 = auVar72._0_4_ * auVar73._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar69._0_4_)),
                                        ZEXT416((uint)fVar212),ZEXT416((uint)fVar213));
              fVar214 = auVar71._0_4_;
              fVar213 = local_900._0_4_ -
                        (auVar17._0_4_ * (fVar213 / fVar214) - fVar216 * (auVar67._0_4_ / fVar214));
              auVar230 = ZEXT464((uint)fVar213);
              fVar212 = (float)local_8c0._0_4_ -
                        (fVar216 * (fVar212 / fVar214) - auVar17._0_4_ * (auVar69._0_4_ / fVar214));
              auVar227 = ZEXT464((uint)fVar212);
              auVar197._8_4_ = 0x7fffffff;
              auVar197._0_8_ = 0x7fffffff7fffffff;
              auVar197._12_4_ = 0x7fffffff;
              auVar67 = vandps_avx(auVar17,auVar197);
              bVar59 = true;
              if (auVar67._0_4_ < auVar18._0_4_) {
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ + auVar70._0_4_)),local_4a0,
                                          ZEXT416(0x36000000));
                auVar67 = vandps_avx(ZEXT416((uint)fVar216),auVar197);
                if (auVar67._0_4_ < auVar17._0_4_) {
                  fVar212 = fVar212 + (float)local_490._0_4_;
                  auVar227 = ZEXT464((uint)fVar212);
                  if (((((ray->org).field_0.m128[3] <= fVar212) &&
                       (fVar214 = ray->tfar, fVar212 <= fVar214)) && (0.0 <= fVar213)) &&
                     (fVar213 <= 1.0)) {
                    auVar110._0_16_ = ZEXT816(0) << 0x20;
                    auVar109._4_28_ = auVar110._4_28_;
                    auVar109._0_4_ = local_8a0._0_4_;
                    auVar67 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar109._0_16_);
                    fVar215 = auVar67._0_4_;
                    auVar67 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                    pGVar8 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar8->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13 = 1;
                      }
                      else {
                        fVar215 = fVar215 * 1.5 + auVar67._0_4_ * fVar215 * fVar215 * fVar215;
                        auVar148._0_4_ = local_780._0_4_ * fVar215;
                        auVar148._4_4_ = local_780._4_4_ * fVar215;
                        auVar148._8_4_ = local_780._8_4_ * fVar215;
                        auVar148._12_4_ = local_780._12_4_ * fVar215;
                        auVar69 = vfmadd213ps_fma(auVar66,auVar148,auVar68);
                        auVar67 = vshufps_avx(auVar148,auVar148,0xc9);
                        auVar66 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar149._0_4_ = auVar148._0_4_ * auVar66._0_4_;
                        auVar149._4_4_ = auVar148._4_4_ * auVar66._4_4_;
                        auVar149._8_4_ = auVar148._8_4_ * auVar66._8_4_;
                        auVar149._12_4_ = auVar148._12_4_ * auVar66._12_4_;
                        auVar17 = vfmsub231ps_fma(auVar149,auVar68,auVar67);
                        auVar67 = vshufps_avx(auVar17,auVar17,0xc9);
                        auVar66 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar17 = vshufps_avx(auVar17,auVar17,0xd2);
                        auVar127._0_4_ = auVar69._0_4_ * auVar17._0_4_;
                        auVar127._4_4_ = auVar69._4_4_ * auVar17._4_4_;
                        auVar127._8_4_ = auVar69._8_4_ * auVar17._8_4_;
                        auVar127._12_4_ = auVar69._12_4_ * auVar17._12_4_;
                        auVar66 = vfmsub231ps_fma(auVar127,auVar67,auVar66);
                        auVar67 = vshufps_avx(auVar66,auVar66,0xe9);
                        local_5d0 = vmovlps_avx(auVar67);
                        local_5c8 = auVar66._0_4_;
                        local_5c0 = 0;
                        local_5bc = (undefined4)local_8d0;
                        local_5b8 = (undefined4)local_8c8;
                        local_5b4 = context->user->instID[0];
                        local_5b0 = context->user->instPrimID[0];
                        ray->tfar = fVar212;
                        local_904 = -1;
                        local_750.valid = &local_904;
                        local_750.geometryUserPtr = pGVar8->userPtr;
                        local_750.context = context->user;
                        local_750.hit = (RTCHitN *)&local_5d0;
                        local_750.N = 1;
                        local_900._0_16_ = ZEXT416((uint)fVar213);
                        local_8c0._0_16_ = ZEXT416((uint)fVar212);
                        local_8a0._0_4_ = fVar214;
                        local_750.ray = (RTCRayN *)ray;
                        local_5c4 = fVar213;
                        if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b4b746:
                          p_Var9 = context->args->filter;
                          if (p_Var9 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar244 = ZEXT1664(auVar244._0_16_);
                              (*p_Var9)(&local_750);
                              auVar227 = ZEXT1664(local_8c0._0_16_);
                              auVar230 = ZEXT1664(local_900._0_16_);
                              auVar261 = ZEXT3264(local_6e0);
                              auVar258 = ZEXT3264(local_6c0);
                              auVar257 = ZEXT3264(local_6a0);
                              auVar256 = ZEXT3264(local_680);
                              auVar254 = ZEXT3264(local_820);
                              auVar253 = ZEXT3264(local_660);
                              auVar252 = ZEXT3264(local_640);
                              auVar251 = ZEXT3264(local_800);
                              auVar250 = ZEXT3264(local_620);
                              auVar249 = ZEXT3264(local_600);
                              auVar248 = ZEXT3264(local_7e0);
                              auVar259 = ZEXT3264(local_7c0);
                              auVar255 = ZEXT3264(local_7a0);
                              auVar197._8_4_ = 0x7fffffff;
                              auVar197._0_8_ = 0x7fffffff7fffffff;
                              auVar197._12_4_ = 0x7fffffff;
                              fVar214 = (float)local_8a0._0_4_;
                            }
                            if (*local_750.valid == 0) goto LAB_01b4b814;
                          }
                          unaff_R13 = 1;
                        }
                        else {
                          auVar240 = ZEXT1664(local_870);
                          auVar244 = ZEXT1664(auVar68);
                          (*pGVar8->occlusionFilterN)(&local_750);
                          auVar227 = ZEXT1664(local_8c0._0_16_);
                          auVar230 = ZEXT1664(local_900._0_16_);
                          auVar261 = ZEXT3264(local_6e0);
                          auVar258 = ZEXT3264(local_6c0);
                          auVar257 = ZEXT3264(local_6a0);
                          auVar256 = ZEXT3264(local_680);
                          auVar254 = ZEXT3264(local_820);
                          auVar253 = ZEXT3264(local_660);
                          auVar252 = ZEXT3264(local_640);
                          auVar251 = ZEXT3264(local_800);
                          auVar250 = ZEXT3264(local_620);
                          auVar249 = ZEXT3264(local_600);
                          auVar248 = ZEXT3264(local_7e0);
                          auVar259 = ZEXT3264(local_7c0);
                          auVar255 = ZEXT3264(local_7a0);
                          auVar197._8_4_ = 0x7fffffff;
                          auVar197._0_8_ = 0x7fffffff7fffffff;
                          auVar197._12_4_ = 0x7fffffff;
                          fVar214 = (float)local_8a0._0_4_;
                          if (*local_750.valid != 0) goto LAB_01b4b746;
LAB_01b4b814:
                          unaff_R13 = 0;
                        }
                        if ((char)unaff_R13 == '\0') {
                          ray->tfar = fVar214;
                        }
                      }
                      bVar59 = false;
                      goto LAB_01b4b565;
                    }
                  }
                  bVar59 = false;
                  unaff_R13 = 0;
                }
              }
LAB_01b4b565:
              bVar57 = (byte)unaff_R13;
              if (!bVar59) goto LAB_01b4b837;
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
            bVar57 = 0;
            auVar197._8_4_ = 0x7fffffff;
            auVar197._0_8_ = 0x7fffffff7fffffff;
            auVar197._12_4_ = 0x7fffffff;
LAB_01b4b837:
            unaff_R13 = (ulong)(bVar57 & 1);
            bVar53 = bVar53 | bVar57 & 1;
            auVar47._4_4_ = fStack_3bc;
            auVar47._0_4_ = local_3c0;
            auVar47._8_4_ = fStack_3b8;
            auVar47._12_4_ = fStack_3b4;
            auVar47._16_4_ = fStack_3b0;
            auVar47._20_4_ = fStack_3ac;
            auVar47._24_4_ = fStack_3a8;
            auVar47._28_4_ = fStack_3a4;
            fVar208 = ray->tfar;
            auVar33._4_4_ = fVar208;
            auVar33._0_4_ = fVar208;
            auVar33._8_4_ = fVar208;
            auVar33._12_4_ = fVar208;
            auVar33._16_4_ = fVar208;
            auVar33._20_4_ = fVar208;
            auVar33._24_4_ = fVar208;
            auVar33._28_4_ = fVar208;
            uVar19 = vcmpps_avx512vl(auVar47,auVar33,2);
            bVar54 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar54 & (byte)uVar19;
          } while (bVar54 != 0);
        }
        auVar137._0_4_ = (float)local_580._0_4_ + (float)local_3e0._0_4_;
        auVar137._4_4_ = (float)local_580._4_4_ + (float)local_3e0._4_4_;
        auVar137._8_4_ = fStack_578 + fStack_3d8;
        auVar137._12_4_ = fStack_574 + fStack_3d4;
        auVar137._16_4_ = fStack_570 + fStack_3d0;
        auVar137._20_4_ = fStack_56c + fStack_3cc;
        auVar137._24_4_ = fStack_568 + fStack_3c8;
        auVar137._28_4_ = fStack_564 + fStack_3c4;
        fVar217 = ray->tfar;
        auVar34._4_4_ = fVar217;
        auVar34._0_4_ = fVar217;
        auVar34._8_4_ = fVar217;
        auVar34._12_4_ = fVar217;
        auVar34._16_4_ = fVar217;
        auVar34._20_4_ = fVar217;
        auVar34._24_4_ = fVar217;
        auVar34._28_4_ = fVar217;
        uVar19 = vcmpps_avx512vl(auVar137,auVar34,2);
        bVar57 = (byte)local_824 | (byte)local_82c;
        bVar55 = (byte)uVar20 & bVar55 & (byte)uVar19;
        auVar138._8_4_ = 2;
        auVar138._0_8_ = 0x200000002;
        auVar138._12_4_ = 2;
        auVar138._16_4_ = 2;
        auVar138._20_4_ = 2;
        auVar138._24_4_ = 2;
        auVar138._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar74 = vpblendmd_avx512vl(auVar138,auVar35);
        local_3e0._0_4_ = (uint)(bVar57 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
        bVar59 = (bool)(bVar57 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * 2;
        bVar59 = (bool)(bVar57 >> 2 & 1);
        fStack_3d8 = (float)((uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)(bVar57 >> 3 & 1);
        fStack_3d4 = (float)((uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)(bVar57 >> 4 & 1);
        fStack_3d0 = (float)((uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)(bVar57 >> 5 & 1);
        fStack_3cc = (float)((uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * 2);
        bVar59 = (bool)(bVar57 >> 6 & 1);
        fStack_3c8 = (float)((uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * 2);
        fStack_3c4 = (float)((uint)(bVar57 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2);
        uVar19 = vpcmpd_avx512vl(_local_3e0,local_340,2);
        bVar57 = (byte)uVar19 & bVar55;
        fVar217 = (float)local_580._0_4_;
        fVar208 = (float)local_580._4_4_;
        fVar212 = fStack_578;
        fVar213 = fStack_574;
        fVar214 = fStack_570;
        fVar215 = fStack_56c;
        fVar216 = fStack_568;
        fVar160 = fStack_564;
        if (bVar57 != 0) {
          auVar66 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar67 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar68 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar17 = vminps_avx(auVar66,auVar68);
          auVar66 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar68 = vmaxps_avx(auVar67,auVar66);
          auVar67 = vandps_avx(auVar17,auVar197);
          auVar66 = vandps_avx(auVar68,auVar197);
          auVar67 = vmaxps_avx(auVar67,auVar66);
          auVar66 = vmovshdup_avx(auVar67);
          auVar66 = vmaxss_avx(auVar66,auVar67);
          auVar67 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxss_avx(auVar67,auVar66);
          fVar229 = auVar67._0_4_ * 1.9073486e-06;
          local_4a0 = vshufps_avx(auVar68,auVar68,0xff);
          _local_420 = _local_280;
          local_3c0 = (float)local_580._0_4_ + (float)local_280._0_4_;
          fStack_3bc = (float)local_580._4_4_ + (float)local_280._4_4_;
          fStack_3b8 = fStack_578 + fStack_278;
          fStack_3b4 = fStack_574 + fStack_274;
          fStack_3b0 = fStack_570 + fStack_270;
          fStack_3ac = fStack_56c + fStack_26c;
          fStack_3a8 = fStack_568 + fStack_268;
          fStack_3a4 = fStack_564 + fStack_264;
          do {
            auVar77 = local_780;
            auVar139._8_4_ = 0x7f800000;
            auVar139._0_8_ = 0x7f8000007f800000;
            auVar139._12_4_ = 0x7f800000;
            auVar139._16_4_ = 0x7f800000;
            auVar139._20_4_ = 0x7f800000;
            auVar139._24_4_ = 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar74 = vblendmps_avx512vl(auVar139,_local_420);
            auVar111._0_4_ =
                 (uint)(bVar57 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
            bVar59 = (bool)(bVar57 >> 1 & 1);
            auVar111._4_4_ = (uint)bVar59 * auVar74._4_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar57 >> 2 & 1);
            auVar111._8_4_ = (uint)bVar59 * auVar74._8_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar57 >> 3 & 1);
            auVar111._12_4_ = (uint)bVar59 * auVar74._12_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar57 >> 4 & 1);
            auVar111._16_4_ = (uint)bVar59 * auVar74._16_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar57 >> 5 & 1);
            auVar111._20_4_ = (uint)bVar59 * auVar74._20_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)(bVar57 >> 6 & 1);
            auVar111._24_4_ = (uint)bVar59 * auVar74._24_4_ | (uint)!bVar59 * 0x7f800000;
            auVar111._28_4_ =
                 (uint)(bVar57 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar57 >> 7) * 0x7f800000;
            auVar74 = vshufps_avx(auVar111,auVar111,0xb1);
            auVar74 = vminps_avx(auVar111,auVar74);
            auVar76 = vshufpd_avx(auVar74,auVar74,5);
            auVar74 = vminps_avx(auVar74,auVar76);
            auVar76 = vpermpd_avx2(auVar74,0x4e);
            auVar74 = vminps_avx(auVar74,auVar76);
            uVar19 = vcmpps_avx512vl(auVar111,auVar74,0);
            bVar51 = (byte)uVar19 & bVar57;
            bVar54 = bVar57;
            if (bVar51 != 0) {
              bVar54 = bVar51;
            }
            iVar1 = 0;
            for (uVar62 = (uint)bVar54; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            auVar230 = ZEXT464(*(uint *)(local_3a0 + (uint)(iVar1 << 2)));
            auVar227 = ZEXT464(*(uint *)(local_260 + (uint)(iVar1 << 2)));
            aVar5 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar5;
            auVar67 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar67._0_4_ < 0.0) {
              local_900._0_16_ = ZEXT416(*(uint *)(local_3a0 + (uint)(iVar1 << 2)));
              local_8c0._0_16_ = ZEXT416(*(uint *)(local_260 + (uint)(iVar1 << 2)));
              local_780[1] = 0;
              local_780[0] = bVar57;
              local_780._2_30_ = auVar77._2_30_;
              fVar232 = sqrtf(auVar67._0_4_);
              bVar57 = local_780[0];
              auVar227 = ZEXT1664(local_8c0._0_16_);
              auVar230 = ZEXT1664(local_900._0_16_);
            }
            else {
              auVar67 = vsqrtss_avx(auVar67,auVar67);
              fVar232 = auVar67._0_4_;
            }
            lVar58 = 5;
            do {
              local_8c0._0_16_ = auVar227._0_16_;
              uVar224 = auVar227._0_4_;
              auVar128._4_4_ = uVar224;
              auVar128._0_4_ = uVar224;
              auVar128._8_4_ = uVar224;
              auVar128._12_4_ = uVar224;
              auVar67 = vfmadd132ps_fma(auVar128,ZEXT816(0) << 0x40,local_4e0._0_16_);
              fVar214 = auVar230._0_4_;
              fVar215 = 1.0 - fVar214;
              fVar217 = fVar214 * fVar214;
              auVar71 = SUB6416(ZEXT464(0x40400000),0);
              auVar70 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar69 = auVar230._0_16_;
              auVar68 = vfmadd213ss_fma(auVar71,auVar69,auVar70);
              auVar66 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar217),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar17 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar215),auVar70);
              auVar17 = vfmadd213ss_fma(auVar17,ZEXT416((uint)(fVar215 * fVar215)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar208 = fVar215 * fVar215 * -fVar214 * 0.5;
              fVar212 = auVar66._0_4_ * 0.5;
              fVar213 = auVar17._0_4_ * 0.5;
              fVar214 = fVar214 * fVar214 * -fVar215 * 0.5;
              auVar186._0_4_ = fVar214 * (float)local_560._0_4_;
              auVar186._4_4_ = fVar214 * (float)local_560._4_4_;
              auVar186._8_4_ = fVar214 * fStack_558;
              auVar186._12_4_ = fVar214 * fStack_554;
              auVar198._4_4_ = fVar213;
              auVar198._0_4_ = fVar213;
              auVar198._8_4_ = fVar213;
              auVar198._12_4_ = fVar213;
              auVar66 = vfmadd132ps_fma(auVar198,auVar186,local_520._0_16_);
              auVar170._4_4_ = fVar212;
              auVar170._0_4_ = fVar212;
              auVar170._8_4_ = fVar212;
              auVar170._12_4_ = fVar212;
              auVar66 = vfmadd132ps_fma(auVar170,auVar66,local_540._0_16_);
              auVar187._4_4_ = fVar208;
              auVar187._0_4_ = fVar208;
              auVar187._8_4_ = fVar208;
              auVar187._12_4_ = fVar208;
              auVar66 = vfmadd132ps_fma(auVar187,auVar66,local_500._0_16_);
              local_430 = vfmadd231ss_fma(auVar70,auVar69,ZEXT416(0x41100000));
              local_440 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar69,ZEXT416(0x40800000)
                                         );
              local_450 = vfmadd213ss_fma(auVar71,auVar69,ZEXT416(0xbf800000));
              local_400._0_16_ = auVar66;
              auVar67 = vsubps_avx(auVar67,auVar66);
              local_780._0_16_ = auVar67;
              auVar67 = vdpps_avx(auVar67,auVar67,0x7f);
              local_900._0_16_ = auVar69;
              local_8a0._0_16_ = auVar67;
              if (auVar67._0_4_ < 0.0) {
                local_700._0_4_ = auVar68._0_4_;
                local_720._0_16_ = ZEXT416((uint)fVar215);
                local_850._0_4_ = fVar217;
                local_860._0_4_ = fVar215 * -2.0;
                auVar244._0_4_ = sqrtf(auVar67._0_4_);
                auVar244._4_60_ = extraout_var_00;
                auVar68 = ZEXT416((uint)local_700._0_4_);
                auVar67 = auVar244._0_16_;
                auVar66 = local_720._0_16_;
                auVar69 = local_900._0_16_;
              }
              else {
                auVar67 = vsqrtss_avx(auVar67,auVar67);
                local_860._0_4_ = fVar215 * -2.0;
                local_850._0_4_ = fVar217;
                auVar66 = ZEXT416((uint)fVar215);
              }
              fVar208 = auVar66._0_4_;
              fVar217 = auVar69._0_4_;
              auVar70 = vfnmadd231ss_fma(ZEXT416((uint)(fVar217 * (fVar208 + fVar208))),auVar66,
                                         auVar66);
              auVar66 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar217 + fVar217)),
                                        ZEXT416((uint)(fVar217 * fVar217 * 3.0)));
              auVar68 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar69,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * fVar208 * -3.0)),
                                        ZEXT416((uint)(fVar208 + fVar208)),auVar68);
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar69,
                                        ZEXT416((uint)local_850._0_4_));
              fVar217 = auVar70._0_4_ * 0.5;
              fVar208 = auVar66._0_4_ * 0.5;
              fVar212 = auVar17._0_4_ * 0.5;
              fVar213 = auVar68._0_4_ * 0.5;
              auVar188._0_4_ = fVar213 * (float)local_560._0_4_;
              auVar188._4_4_ = fVar213 * (float)local_560._4_4_;
              auVar188._8_4_ = fVar213 * fStack_558;
              auVar188._12_4_ = fVar213 * fStack_554;
              auVar171._4_4_ = fVar212;
              auVar171._0_4_ = fVar212;
              auVar171._8_4_ = fVar212;
              auVar171._12_4_ = fVar212;
              auVar66 = vfmadd132ps_fma(auVar171,auVar188,local_520._0_16_);
              auVar150._4_4_ = fVar208;
              auVar150._0_4_ = fVar208;
              auVar150._8_4_ = fVar208;
              auVar150._12_4_ = fVar208;
              auVar66 = vfmadd132ps_fma(auVar150,auVar66,local_540._0_16_);
              auVar243._4_4_ = fVar217;
              auVar243._0_4_ = fVar217;
              auVar243._8_4_ = fVar217;
              auVar243._12_4_ = fVar217;
              local_700._0_16_ = vfmadd132ps_fma(auVar243,auVar66,local_500._0_16_);
              local_850 = vdpps_avx(local_700._0_16_,local_700._0_16_,0x7f);
              auVar46._12_4_ = 0;
              auVar46._0_12_ = ZEXT812(0);
              fVar217 = local_850._0_4_;
              local_870 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar217));
              fVar208 = local_870._0_4_;
              local_860 = vrcp14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)fVar217));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(local_850,auVar25);
              auVar66 = vfnmadd213ss_fma(local_860,local_850,SUB6416(ZEXT464(0x40000000),0));
              local_720._0_4_ = auVar67._0_4_;
              if (fVar217 < auVar68._0_4_) {
                fVar212 = sqrtf(fVar217);
                auVar67 = ZEXT416((uint)local_720._0_4_);
                auVar68 = local_700._0_16_;
              }
              else {
                auVar68 = vsqrtss_avx(local_850,local_850);
                fVar212 = auVar68._0_4_;
                auVar68 = local_700._0_16_;
              }
              fVar213 = local_870._0_4_;
              fVar217 = fVar208 * 1.5 + fVar217 * -0.5 * fVar213 * fVar213 * fVar213;
              local_870._0_4_ = auVar68._0_4_ * fVar217;
              local_870._4_4_ = auVar68._4_4_ * fVar217;
              local_870._8_4_ = auVar68._8_4_ * fVar217;
              local_870._12_4_ = auVar68._12_4_ * fVar217;
              auVar17 = vdpps_avx(local_780._0_16_,local_870,0x7f);
              fVar213 = auVar67._0_4_;
              auVar129._0_4_ = auVar17._0_4_ * auVar17._0_4_;
              auVar129._4_4_ = auVar17._4_4_ * auVar17._4_4_;
              auVar129._8_4_ = auVar17._8_4_ * auVar17._8_4_;
              auVar129._12_4_ = auVar17._12_4_ * auVar17._12_4_;
              auVar70 = vsubps_avx512vl(local_8a0._0_16_,auVar129);
              fVar208 = auVar70._0_4_;
              auVar151._4_12_ = ZEXT812(0) << 0x20;
              auVar151._0_4_ = fVar208;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151);
              auVar71 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              if (fVar208 < 0.0) {
                local_480 = fVar217;
                fStack_47c = fVar217;
                fStack_478 = fVar217;
                fStack_474 = fVar217;
                local_470 = auVar69;
                local_460 = auVar17;
                fVar234 = sqrtf(fVar208);
                auVar71 = ZEXT416(auVar71._0_4_);
                auVar67 = ZEXT416((uint)local_720._0_4_);
                auVar68 = local_700._0_16_;
                auVar17 = local_460;
                auVar69 = local_470;
                fVar217 = local_480;
                fVar214 = fStack_47c;
                fVar215 = fStack_478;
                fVar216 = fStack_474;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
                fVar234 = auVar70._0_4_;
                fVar214 = fVar217;
                fVar215 = fVar217;
                fVar216 = fVar217;
              }
              auVar244 = ZEXT1664(auVar68);
              auVar255 = ZEXT3264(local_7a0);
              auVar259 = ZEXT3264(local_7c0);
              auVar248 = ZEXT3264(local_7e0);
              auVar249 = ZEXT3264(local_600);
              auVar250 = ZEXT3264(local_620);
              auVar251 = ZEXT3264(local_800);
              auVar252 = ZEXT3264(local_640);
              auVar253 = ZEXT3264(local_660);
              auVar254 = ZEXT3264(local_820);
              auVar256 = ZEXT3264(local_680);
              auVar257 = ZEXT3264(local_6a0);
              auVar258 = ZEXT3264(local_6c0);
              auVar261 = ZEXT3264(local_6e0);
              auVar152._0_4_ = (float)local_450._0_4_ * (float)local_560._0_4_;
              auVar152._4_4_ = (float)local_450._0_4_ * (float)local_560._4_4_;
              auVar152._8_4_ = (float)local_450._0_4_ * fStack_558;
              auVar152._12_4_ = (float)local_450._0_4_ * fStack_554;
              auVar172._4_4_ = local_440._0_4_;
              auVar172._0_4_ = local_440._0_4_;
              auVar172._8_4_ = local_440._0_4_;
              auVar172._12_4_ = local_440._0_4_;
              auVar70 = vfmadd132ps_fma(auVar172,auVar152,local_520._0_16_);
              auVar153._4_4_ = local_430._0_4_;
              auVar153._0_4_ = local_430._0_4_;
              auVar153._8_4_ = local_430._0_4_;
              auVar153._12_4_ = local_430._0_4_;
              auVar70 = vfmadd132ps_fma(auVar153,auVar70,local_540._0_16_);
              auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),local_900._0_16_,
                                        ZEXT416(0x40000000));
              auVar173._0_4_ = auVar18._0_4_;
              auVar173._4_4_ = auVar173._0_4_;
              auVar173._8_4_ = auVar173._0_4_;
              auVar173._12_4_ = auVar173._0_4_;
              auVar70 = vfmadd132ps_fma(auVar173,auVar70,local_500._0_16_);
              auVar154._0_4_ = auVar70._0_4_ * (float)local_850._0_4_;
              auVar154._4_4_ = auVar70._4_4_ * (float)local_850._0_4_;
              auVar154._8_4_ = auVar70._8_4_ * (float)local_850._0_4_;
              auVar154._12_4_ = auVar70._12_4_ * (float)local_850._0_4_;
              auVar70 = vdpps_avx(auVar68,auVar70,0x7f);
              fVar160 = auVar70._0_4_;
              auVar174._0_4_ = auVar68._0_4_ * fVar160;
              auVar174._4_4_ = auVar68._4_4_ * fVar160;
              auVar174._8_4_ = auVar68._8_4_ * fVar160;
              auVar174._12_4_ = auVar68._12_4_ * fVar160;
              auVar18 = vsubps_avx(auVar154,auVar174);
              fVar160 = auVar66._0_4_ * (float)local_860._0_4_;
              auVar70 = vmaxss_avx(ZEXT416((uint)fVar229),
                                   ZEXT416((uint)((float)local_8c0._0_4_ * fVar232 * 1.9073486e-06))
                                  );
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar113._16_16_ = local_6e0._16_16_;
              auVar72 = vxorps_avx512vl(auVar68,auVar26);
              auVar175._0_4_ = fVar217 * auVar18._0_4_ * fVar160;
              auVar175._4_4_ = fVar214 * auVar18._4_4_ * fVar160;
              auVar175._8_4_ = fVar215 * auVar18._8_4_ * fVar160;
              auVar175._12_4_ = fVar216 * auVar18._12_4_ * fVar160;
              auVar240 = ZEXT1664(local_870);
              auVar66 = vdpps_avx(auVar72,local_870,0x7f);
              auVar18 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar229),auVar70);
              auVar67 = vdpps_avx(local_780._0_16_,auVar175,0x7f);
              auVar18 = vfmadd213ss_fma(ZEXT416((uint)(fVar213 + 1.0)),
                                        ZEXT416((uint)(fVar229 / fVar212)),auVar18);
              fVar217 = auVar66._0_4_ + auVar67._0_4_;
              auVar67 = vdpps_avx(local_4e0._0_16_,local_870,0x7f);
              auVar66 = vdpps_avx(local_780._0_16_,auVar72,0x7f);
              fVar212 = auVar69._0_4_;
              auVar73 = vaddss_avx512f(auVar71,ZEXT416((uint)(fVar212 * fVar208 * -0.5 *
                                                             fVar212 * fVar212)));
              auVar69 = vdpps_avx(local_780._0_16_,local_4e0._0_16_,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar66,auVar17,ZEXT416((uint)fVar217));
              auVar72 = vfnmadd231ss_fma(auVar69,auVar17,auVar67);
              auVar66 = vpermilps_avx(local_400._0_16_,0xff);
              fVar234 = fVar234 - auVar66._0_4_;
              auVar66 = vshufps_avx(auVar68,auVar68,0xff);
              auVar69 = vfmsub213ss_fma(auVar71,auVar73,auVar66);
              fVar208 = auVar72._0_4_ * auVar73._0_4_;
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar69._0_4_)),
                                        ZEXT416((uint)fVar217),ZEXT416((uint)fVar208));
              fVar212 = auVar71._0_4_;
              fVar237 = local_900._0_4_ -
                        (auVar17._0_4_ * (fVar208 / fVar212) - fVar234 * (auVar67._0_4_ / fVar212));
              auVar230 = ZEXT464((uint)fVar237);
              fVar236 = (float)local_8c0._0_4_ -
                        (fVar234 * (fVar217 / fVar212) - auVar17._0_4_ * (auVar69._0_4_ / fVar212));
              auVar227 = ZEXT464((uint)fVar236);
              auVar199._8_4_ = 0x7fffffff;
              auVar199._0_8_ = 0x7fffffff7fffffff;
              auVar199._12_4_ = 0x7fffffff;
              auVar67 = vandps_avx(auVar17,auVar199);
              bVar59 = true;
              fVar217 = (float)local_580._0_4_;
              fVar208 = (float)local_580._4_4_;
              fVar212 = fStack_578;
              fVar213 = fStack_574;
              fVar214 = fStack_570;
              fVar215 = fStack_56c;
              fVar216 = fStack_568;
              fVar160 = fStack_564;
              if (auVar67._0_4_ < auVar18._0_4_) {
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ + auVar70._0_4_)),local_4a0,
                                          ZEXT416(0x36000000));
                auVar67 = vandps_avx(ZEXT416((uint)fVar234),auVar199);
                if (auVar67._0_4_ < auVar17._0_4_) {
                  fVar236 = fVar236 + (float)local_490._0_4_;
                  auVar227 = ZEXT464((uint)fVar236);
                  if (((((ray->org).field_0.m128[3] <= fVar236) &&
                       (fVar234 = ray->tfar, fVar236 <= fVar234)) && (0.0 <= fVar237)) &&
                     (fVar237 <= 1.0)) {
                    auVar113._0_16_ = ZEXT816(0) << 0x20;
                    auVar112._4_28_ = auVar113._4_28_;
                    auVar112._0_4_ = local_8a0._0_4_;
                    auVar67 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar112._0_16_);
                    fVar228 = auVar67._0_4_;
                    auVar67 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                    pGVar8 = (context->scene->geometries).items[local_8c8].ptr;
                    if ((pGVar8->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        unaff_R13 = 1;
                      }
                      else {
                        fVar217 = fVar228 * 1.5 + auVar67._0_4_ * fVar228 * fVar228 * fVar228;
                        auVar155._0_4_ = local_780._0_4_ * fVar217;
                        auVar155._4_4_ = local_780._4_4_ * fVar217;
                        auVar155._8_4_ = local_780._8_4_ * fVar217;
                        auVar155._12_4_ = local_780._12_4_ * fVar217;
                        auVar69 = vfmadd213ps_fma(auVar66,auVar155,auVar68);
                        auVar67 = vshufps_avx(auVar155,auVar155,0xc9);
                        auVar66 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar156._0_4_ = auVar155._0_4_ * auVar66._0_4_;
                        auVar156._4_4_ = auVar155._4_4_ * auVar66._4_4_;
                        auVar156._8_4_ = auVar155._8_4_ * auVar66._8_4_;
                        auVar156._12_4_ = auVar155._12_4_ * auVar66._12_4_;
                        auVar17 = vfmsub231ps_fma(auVar156,auVar68,auVar67);
                        auVar67 = vshufps_avx(auVar17,auVar17,0xc9);
                        auVar66 = vshufps_avx(auVar69,auVar69,0xc9);
                        auVar17 = vshufps_avx(auVar17,auVar17,0xd2);
                        auVar130._0_4_ = auVar69._0_4_ * auVar17._0_4_;
                        auVar130._4_4_ = auVar69._4_4_ * auVar17._4_4_;
                        auVar130._8_4_ = auVar69._8_4_ * auVar17._8_4_;
                        auVar130._12_4_ = auVar69._12_4_ * auVar17._12_4_;
                        auVar66 = vfmsub231ps_fma(auVar130,auVar67,auVar66);
                        auVar67 = vshufps_avx(auVar66,auVar66,0xe9);
                        local_5d0 = vmovlps_avx(auVar67);
                        local_5c8 = auVar66._0_4_;
                        local_5c0 = 0;
                        local_5bc = (undefined4)local_8d0;
                        local_5b8 = (undefined4)local_8c8;
                        local_5b4 = context->user->instID[0];
                        local_5b0 = context->user->instPrimID[0];
                        ray->tfar = fVar236;
                        local_904 = -1;
                        local_750.valid = &local_904;
                        local_750.geometryUserPtr = pGVar8->userPtr;
                        local_750.context = context->user;
                        local_750.hit = (RTCHitN *)&local_5d0;
                        local_750.N = 1;
                        local_900._0_16_ = ZEXT416((uint)fVar237);
                        local_8c0._0_16_ = ZEXT416((uint)fVar236);
                        local_8a0._0_4_ = fVar234;
                        local_750.ray = (RTCRayN *)ray;
                        local_5c4 = fVar237;
                        if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b4c350:
                          p_Var9 = context->args->filter;
                          fVar217 = (float)local_580._0_4_;
                          fVar208 = (float)local_580._4_4_;
                          fVar212 = fStack_578;
                          fVar213 = fStack_574;
                          fVar214 = fStack_570;
                          fVar215 = fStack_56c;
                          fVar216 = fStack_568;
                          fVar160 = fStack_564;
                          if (p_Var9 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar244 = ZEXT1664(auVar244._0_16_);
                              (*p_Var9)(&local_750);
                              auVar227 = ZEXT1664(local_8c0._0_16_);
                              auVar230 = ZEXT1664(local_900._0_16_);
                              auVar261 = ZEXT3264(local_6e0);
                              auVar258 = ZEXT3264(local_6c0);
                              auVar257 = ZEXT3264(local_6a0);
                              auVar256 = ZEXT3264(local_680);
                              auVar254 = ZEXT3264(local_820);
                              auVar253 = ZEXT3264(local_660);
                              auVar252 = ZEXT3264(local_640);
                              auVar251 = ZEXT3264(local_800);
                              auVar250 = ZEXT3264(local_620);
                              auVar249 = ZEXT3264(local_600);
                              auVar248 = ZEXT3264(local_7e0);
                              auVar259 = ZEXT3264(local_7c0);
                              auVar255 = ZEXT3264(local_7a0);
                              fVar217 = (float)local_580._0_4_;
                              fVar208 = (float)local_580._4_4_;
                              fVar212 = fStack_578;
                              fVar213 = fStack_574;
                              fVar214 = fStack_570;
                              fVar215 = fStack_56c;
                              fVar216 = fStack_568;
                              fVar160 = fStack_564;
                              fVar234 = (float)local_8a0._0_4_;
                            }
                            if (*local_750.valid == 0) goto LAB_01b4c41e;
                          }
                          unaff_R13 = 1;
                        }
                        else {
                          auVar240 = ZEXT1664(local_870);
                          auVar244 = ZEXT1664(auVar68);
                          (*pGVar8->occlusionFilterN)(&local_750);
                          auVar227 = ZEXT1664(local_8c0._0_16_);
                          auVar230 = ZEXT1664(local_900._0_16_);
                          auVar261 = ZEXT3264(local_6e0);
                          auVar258 = ZEXT3264(local_6c0);
                          auVar257 = ZEXT3264(local_6a0);
                          auVar256 = ZEXT3264(local_680);
                          auVar254 = ZEXT3264(local_820);
                          auVar253 = ZEXT3264(local_660);
                          auVar252 = ZEXT3264(local_640);
                          auVar251 = ZEXT3264(local_800);
                          auVar250 = ZEXT3264(local_620);
                          auVar249 = ZEXT3264(local_600);
                          auVar248 = ZEXT3264(local_7e0);
                          auVar259 = ZEXT3264(local_7c0);
                          auVar255 = ZEXT3264(local_7a0);
                          fVar217 = (float)local_580._0_4_;
                          fVar208 = (float)local_580._4_4_;
                          fVar212 = fStack_578;
                          fVar213 = fStack_574;
                          fVar214 = fStack_570;
                          fVar215 = fStack_56c;
                          fVar216 = fStack_568;
                          fVar160 = fStack_564;
                          fVar234 = (float)local_8a0._0_4_;
                          if (*local_750.valid != 0) goto LAB_01b4c350;
LAB_01b4c41e:
                          unaff_R13 = 0;
                        }
                        if ((char)unaff_R13 == '\0') {
                          ray->tfar = fVar234;
                        }
                      }
                      bVar59 = false;
                      goto LAB_01b4c16f;
                    }
                  }
                  bVar59 = false;
                  unaff_R13 = 0;
                }
              }
LAB_01b4c16f:
              bVar54 = (byte)unaff_R13;
              if (!bVar59) goto LAB_01b4c438;
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
            bVar54 = 0;
LAB_01b4c438:
            unaff_R13 = (ulong)(bVar54 & 1);
            bVar53 = bVar53 | bVar54 & 1;
            auVar48._4_4_ = fStack_3bc;
            auVar48._0_4_ = local_3c0;
            auVar48._8_4_ = fStack_3b8;
            auVar48._12_4_ = fStack_3b4;
            auVar48._16_4_ = fStack_3b0;
            auVar48._20_4_ = fStack_3ac;
            auVar48._24_4_ = fStack_3a8;
            auVar48._28_4_ = fStack_3a4;
            fVar232 = ray->tfar;
            auVar36._4_4_ = fVar232;
            auVar36._0_4_ = fVar232;
            auVar36._8_4_ = fVar232;
            auVar36._12_4_ = fVar232;
            auVar36._16_4_ = fVar232;
            auVar36._20_4_ = fVar232;
            auVar36._24_4_ = fVar232;
            auVar36._28_4_ = fVar232;
            uVar19 = vcmpps_avx512vl(auVar48,auVar36,2);
            bVar57 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar57 & (byte)uVar19;
          } while (bVar57 != 0);
        }
        uVar20 = vpcmpd_avx512vl(local_340,_local_3e0,1);
        uVar21 = vpcmpd_avx512vl(local_340,local_240,1);
        auVar158._0_4_ = fVar217 + (float)local_2c0._0_4_;
        auVar158._4_4_ = fVar208 + (float)local_2c0._4_4_;
        auVar158._8_4_ = fVar212 + fStack_2b8;
        auVar158._12_4_ = fVar213 + fStack_2b4;
        auVar158._16_4_ = fVar214 + fStack_2b0;
        auVar158._20_4_ = fVar215 + fStack_2ac;
        auVar158._24_4_ = fVar216 + fStack_2a8;
        auVar158._28_4_ = fVar160 + fStack_2a4;
        fVar229 = ray->tfar;
        auVar177._4_4_ = fVar229;
        auVar177._0_4_ = fVar229;
        auVar177._8_4_ = fVar229;
        auVar177._12_4_ = fVar229;
        auVar177._16_4_ = fVar229;
        auVar177._20_4_ = fVar229;
        auVar177._24_4_ = fVar229;
        auVar177._28_4_ = fVar229;
        uVar19 = vcmpps_avx512vl(auVar158,auVar177,2);
        bVar57 = (byte)local_828 & (byte)uVar21 & (byte)uVar19;
        auVar192._0_4_ = fVar217 + (float)local_280._0_4_;
        auVar192._4_4_ = fVar208 + (float)local_280._4_4_;
        auVar192._8_4_ = fVar212 + fStack_278;
        auVar192._12_4_ = fVar213 + fStack_274;
        auVar192._16_4_ = fVar214 + fStack_270;
        auVar192._20_4_ = fVar215 + fStack_26c;
        auVar192._24_4_ = fVar216 + fStack_268;
        auVar192._28_4_ = fVar160 + fStack_264;
        uVar19 = vcmpps_avx512vl(auVar192,auVar177,2);
        bVar55 = bVar55 & (byte)uVar20 & (byte)uVar19 | bVar57;
        if (bVar55 != 0) {
          uVar61 = local_588 & 0xffffffff;
          abStack_180[uVar61 * 0x60] = bVar55;
          auVar114._0_4_ =
               (uint)(bVar57 & 1) * local_2c0._0_4_ | (uint)!(bool)(bVar57 & 1) * local_280._0_4_;
          bVar59 = (bool)(bVar57 >> 1 & 1);
          auVar114._4_4_ = (uint)bVar59 * local_2c0._4_4_ | (uint)!bVar59 * local_280._4_4_;
          bVar59 = (bool)(bVar57 >> 2 & 1);
          auVar114._8_4_ = (uint)bVar59 * (int)fStack_2b8 | (uint)!bVar59 * (int)fStack_278;
          bVar59 = (bool)(bVar57 >> 3 & 1);
          auVar114._12_4_ = (uint)bVar59 * (int)fStack_2b4 | (uint)!bVar59 * (int)fStack_274;
          bVar59 = (bool)(bVar57 >> 4 & 1);
          auVar114._16_4_ = (uint)bVar59 * (int)fStack_2b0 | (uint)!bVar59 * (int)fStack_270;
          bVar59 = (bool)(bVar57 >> 5 & 1);
          auVar114._20_4_ = (uint)bVar59 * (int)fStack_2ac | (uint)!bVar59 * (int)fStack_26c;
          bVar59 = (bool)(bVar57 >> 6 & 1);
          auVar114._24_4_ = (uint)bVar59 * (int)fStack_2a8 | (uint)!bVar59 * (int)fStack_268;
          auVar114._28_4_ =
               (uint)(bVar57 >> 7) * (int)fStack_2a4 | (uint)!(bool)(bVar57 >> 7) * (int)fStack_264;
          *(undefined1 (*) [32])(auStack_160 + uVar61 * 0x60) = auVar114;
          uVar19 = vmovlps_avx(local_4b0);
          *(undefined8 *)(afStack_140 + uVar61 * 0x18) = uVar19;
          auStack_138[uVar61 * 0x18] = (int)local_838 + 1;
          local_588 = (ulong)((int)local_588 + 1);
        }
        auVar193 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        prim = local_598;
      }
    }
    fVar229 = ray->tfar;
    auVar140._4_4_ = fVar229;
    auVar140._0_4_ = fVar229;
    auVar140._8_4_ = fVar229;
    auVar140._12_4_ = fVar229;
    auVar140._16_4_ = fVar229;
    auVar140._20_4_ = fVar229;
    auVar140._24_4_ = fVar229;
    auVar140._28_4_ = fVar229;
    uVar61 = local_588;
    do {
      if ((int)uVar61 == 0) {
        if (bVar53 != 0) {
          return bVar60;
        }
        fVar217 = ray->tfar;
        auVar27._4_4_ = fVar217;
        auVar27._0_4_ = fVar217;
        auVar27._8_4_ = fVar217;
        auVar27._12_4_ = fVar217;
        uVar19 = vcmpps_avx512vl(local_350,auVar27,2);
        uVar62 = (uint)local_590 & (uint)uVar19;
        local_590 = (ulong)uVar62;
        bVar60 = uVar62 != 0;
        if (!bVar60) {
          return bVar60;
        }
        goto LAB_01b49dfd;
      }
      uVar52 = (ulong)((int)uVar61 - 1);
      lVar58 = uVar52 * 0x60;
      auVar74 = *(undefined1 (*) [32])(auStack_160 + lVar58);
      auVar178._0_4_ = fVar217 + auVar74._0_4_;
      auVar178._4_4_ = fVar208 + auVar74._4_4_;
      auVar178._8_4_ = fVar212 + auVar74._8_4_;
      auVar178._12_4_ = fVar213 + auVar74._12_4_;
      auVar178._16_4_ = fVar214 + auVar74._16_4_;
      auVar178._20_4_ = fVar215 + auVar74._20_4_;
      auVar178._24_4_ = fVar216 + auVar74._24_4_;
      auVar178._28_4_ = fVar160 + auVar74._28_4_;
      uVar19 = vcmpps_avx512vl(auVar178,auVar140,2);
      uVar62 = (uint)uVar19 & (uint)abStack_180[lVar58];
      bVar55 = (byte)uVar62;
      local_588 = uVar52;
      if (uVar62 != 0) {
        auVar179._8_4_ = 0x7f800000;
        auVar179._0_8_ = 0x7f8000007f800000;
        auVar179._12_4_ = 0x7f800000;
        auVar179._16_4_ = 0x7f800000;
        auVar179._20_4_ = 0x7f800000;
        auVar179._24_4_ = 0x7f800000;
        auVar179._28_4_ = 0x7f800000;
        auVar76 = vblendmps_avx512vl(auVar179,auVar74);
        auVar115._0_4_ =
             (uint)(bVar55 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)auVar74._0_4_;
        bVar59 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar59 * auVar76._4_4_ | (uint)!bVar59 * (int)auVar74._4_4_;
        bVar59 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar59 * auVar76._8_4_ | (uint)!bVar59 * (int)auVar74._8_4_;
        bVar59 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar59 * auVar76._12_4_ | (uint)!bVar59 * (int)auVar74._12_4_;
        bVar59 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar115._16_4_ = (uint)bVar59 * auVar76._16_4_ | (uint)!bVar59 * (int)auVar74._16_4_;
        bVar59 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar115._20_4_ = (uint)bVar59 * auVar76._20_4_ | (uint)!bVar59 * (int)auVar74._20_4_;
        bVar59 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar115._24_4_ = (uint)bVar59 * auVar76._24_4_ | (uint)!bVar59 * (int)auVar74._24_4_;
        auVar115._28_4_ =
             (uVar62 >> 7) * auVar76._28_4_ | (uint)!SUB41(uVar62 >> 7,0) * (int)auVar74._28_4_;
        auVar74 = vshufps_avx(auVar115,auVar115,0xb1);
        auVar74 = vminps_avx(auVar115,auVar74);
        auVar76 = vshufpd_avx(auVar74,auVar74,5);
        auVar74 = vminps_avx(auVar74,auVar76);
        auVar76 = vpermpd_avx2(auVar74,0x4e);
        auVar74 = vminps_avx(auVar74,auVar76);
        uVar19 = vcmpps_avx512vl(auVar115,auVar74,0);
        bVar57 = (byte)uVar19 & bVar55;
        if (bVar57 != 0) {
          uVar62 = (uint)bVar57;
        }
        fVar229 = afStack_140[uVar52 * 0x18 + 1];
        uVar116 = 0;
        for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
          uVar116 = uVar116 + 1;
        }
        unaff_R13 = (ulong)auStack_138[uVar52 * 0x18];
        bVar57 = ~('\x01' << ((byte)uVar116 & 0x1f)) & bVar55;
        abStack_180[lVar58] = bVar57;
        auVar193 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar57 != 0) {
          local_588 = uVar61 & 0xffffffff;
        }
        fVar232 = afStack_140[uVar52 * 0x18];
        auVar180._4_4_ = fVar232;
        auVar180._0_4_ = fVar232;
        auVar180._8_4_ = fVar232;
        auVar180._12_4_ = fVar232;
        auVar180._16_4_ = fVar232;
        auVar180._20_4_ = fVar232;
        auVar180._24_4_ = fVar232;
        auVar180._28_4_ = fVar232;
        fVar229 = fVar229 - fVar232;
        auVar159._4_4_ = fVar229;
        auVar159._0_4_ = fVar229;
        auVar159._8_4_ = fVar229;
        auVar159._12_4_ = fVar229;
        auVar159._16_4_ = fVar229;
        auVar159._20_4_ = fVar229;
        auVar159._24_4_ = fVar229;
        auVar159._28_4_ = fVar229;
        auVar67 = vfmadd132ps_fma(auVar159,auVar180,_DAT_02020f20);
        _local_2c0 = ZEXT1632(auVar67);
        local_4b0._8_8_ = 0;
        local_4b0._0_8_ = *(ulong *)(local_2c0 + (ulong)uVar116 * 4);
        local_838 = unaff_R13;
      }
      uVar61 = local_588;
    } while (bVar55 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }